

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined6 uVar38;
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  int iVar60;
  undefined4 uVar61;
  ulong uVar62;
  undefined4 uVar68;
  undefined8 uVar63;
  RayK<4> *pRVar64;
  RTCFilterFunctionN p_Var65;
  undefined1 (*pauVar66) [16];
  long lVar67;
  RTCIntersectArguments *pRVar69;
  ulong uVar70;
  bool bVar71;
  long lVar72;
  ulong uVar73;
  int iVar74;
  ulong uVar75;
  bool bVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  short sVar81;
  undefined2 uVar120;
  float fVar82;
  float fVar83;
  float fVar121;
  float fVar123;
  __m128 a_1;
  float fVar122;
  float fVar124;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar125;
  float fVar158;
  float fVar159;
  vfloat_impl<4> t;
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  float fVar160;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar161;
  float fVar174;
  float fVar175;
  vfloat4 v;
  float fVar162;
  float fVar176;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar177;
  float fVar199;
  float fVar200;
  vfloat4 v_1;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar201;
  float fVar204;
  float fVar205;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar231;
  float fVar232;
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [16];
  float fVar233;
  float fVar244;
  float fVar245;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar246;
  float fVar256;
  float fVar257;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar258;
  float fVar263;
  float fVar264;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar265;
  float fVar274;
  float fVar275;
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar276;
  float fVar277;
  undefined1 auVar273 [16];
  float fVar278;
  float fVar279;
  float fVar288;
  float fVar290;
  undefined1 auVar280 [16];
  undefined1 auVar283 [16];
  float fVar289;
  float fVar291;
  float fVar292;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar293;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  float fVar303;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar317;
  float fVar321;
  float fVar322;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  Vec3fa dir;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 local_618;
  undefined8 local_5c8;
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_5a8 [16];
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [4];
  float fStack_534;
  undefined8 uStack_530;
  RTCRayQueryContext *local_528;
  RayK<4> *local_520;
  RTCHitN *local_518;
  uint local_510;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  undefined4 uStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 (*local_468) [16];
  ulong local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  Primitive *local_3b8;
  ulong local_3b0;
  uint local_3a8;
  uint uStack_3a4;
  uint uStack_3a0;
  uint uStack_39c;
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined4 local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  uint local_248;
  uint uStack_244;
  uint uStack_240;
  uint uStack_23c;
  uint local_238;
  uint uStack_234;
  uint uStack_230;
  uint uStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  float local_108 [4];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 uVar119;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [16];
  undefined1 auVar243 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar255 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  
  PVar17 = prim[1];
  uVar62 = (ulong)(byte)PVar17;
  lVar67 = uVar62 * 0x25;
  pPVar8 = prim + lVar67 + 6;
  fVar175 = *(float *)(pPVar8 + 0xc);
  fVar177 = (*(float *)(ray + k * 4) - *(float *)pPVar8) * fVar175;
  fVar199 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar8 + 4)) * fVar175;
  fVar200 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar8 + 8)) * fVar175;
  fVar161 = *(float *)(ray + k * 4 + 0x40) * fVar175;
  fVar174 = *(float *)(ray + k * 4 + 0x50) * fVar175;
  fVar175 = *(float *)(ray + k * 4 + 0x60) * fVar175;
  uVar61 = *(undefined4 *)(prim + uVar62 * 4 + 6);
  uVar119 = (undefined1)((uint)uVar61 >> 0x18);
  uVar120 = CONCAT11(uVar119,uVar119);
  uVar119 = (undefined1)((uint)uVar61 >> 0x10);
  uVar63 = CONCAT35(CONCAT21(uVar120,uVar119),CONCAT14(uVar119,uVar61));
  uVar119 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar63 >> 0x20),uVar119),uVar119);
  sVar81 = CONCAT11((char)uVar61,(char)uVar61);
  uVar75 = CONCAT62(uVar38,sVar81);
  auVar270._8_4_ = 0;
  auVar270._0_8_ = uVar75;
  auVar270._12_2_ = uVar120;
  auVar270._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar63 >> 0x20);
  auVar164._12_4_ = auVar270._12_4_;
  auVar164._8_2_ = 0;
  auVar164._0_8_ = uVar75;
  auVar164._10_2_ = uVar120;
  auVar84._10_6_ = auVar164._10_6_;
  auVar84._8_2_ = uVar120;
  auVar84._0_8_ = uVar75;
  uVar120 = (undefined2)uVar38;
  auVar39._4_8_ = auVar84._8_8_;
  auVar39._2_2_ = uVar120;
  auVar39._0_2_ = uVar120;
  fVar82 = (float)((int)sVar81 >> 8);
  fVar121 = (float)(auVar39._0_4_ >> 0x18);
  fVar123 = (float)(auVar84._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 5 + 6);
  uVar119 = (undefined1)((uint)uVar61 >> 0x18);
  uVar120 = CONCAT11(uVar119,uVar119);
  uVar119 = (undefined1)((uint)uVar61 >> 0x10);
  uVar63 = CONCAT35(CONCAT21(uVar120,uVar119),CONCAT14(uVar119,uVar61));
  uVar119 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar63 >> 0x20),uVar119),uVar119);
  sVar81 = CONCAT11((char)uVar61,(char)uVar61);
  uVar75 = CONCAT62(uVar38,sVar81);
  auVar128._8_4_ = 0;
  auVar128._0_8_ = uVar75;
  auVar128._12_2_ = uVar120;
  auVar128._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar63 >> 0x20);
  auVar127._12_4_ = auVar128._12_4_;
  auVar127._8_2_ = 0;
  auVar127._0_8_ = uVar75;
  auVar127._10_2_ = uVar120;
  auVar126._10_6_ = auVar127._10_6_;
  auVar126._8_2_ = uVar120;
  auVar126._0_8_ = uVar75;
  uVar120 = (undefined2)uVar38;
  auVar40._4_8_ = auVar126._8_8_;
  auVar40._2_2_ = uVar120;
  auVar40._0_2_ = uVar120;
  fVar201 = (float)((int)sVar81 >> 8);
  fVar204 = (float)(auVar40._0_4_ >> 0x18);
  fVar205 = (float)(auVar126._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 6 + 6);
  uVar119 = (undefined1)((uint)uVar61 >> 0x18);
  uVar120 = CONCAT11(uVar119,uVar119);
  uVar119 = (undefined1)((uint)uVar61 >> 0x10);
  uVar63 = CONCAT35(CONCAT21(uVar120,uVar119),CONCAT14(uVar119,uVar61));
  uVar119 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar63 >> 0x20),uVar119),uVar119);
  sVar81 = CONCAT11((char)uVar61,(char)uVar61);
  uVar75 = CONCAT62(uVar38,sVar81);
  auVar131._8_4_ = 0;
  auVar131._0_8_ = uVar75;
  auVar131._12_2_ = uVar120;
  auVar131._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar63 >> 0x20);
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._8_2_ = 0;
  auVar130._0_8_ = uVar75;
  auVar130._10_2_ = uVar120;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._8_2_ = uVar120;
  auVar129._0_8_ = uVar75;
  uVar120 = (undefined2)uVar38;
  auVar41._4_8_ = auVar129._8_8_;
  auVar41._2_2_ = uVar120;
  auVar41._0_2_ = uVar120;
  fVar233 = (float)((int)sVar81 >> 8);
  fVar244 = (float)(auVar41._0_4_ >> 0x18);
  fVar245 = (float)(auVar129._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 0xf + 6);
  uVar119 = (undefined1)((uint)uVar61 >> 0x18);
  uVar120 = CONCAT11(uVar119,uVar119);
  uVar119 = (undefined1)((uint)uVar61 >> 0x10);
  uVar63 = CONCAT35(CONCAT21(uVar120,uVar119),CONCAT14(uVar119,uVar61));
  uVar119 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar63 >> 0x20),uVar119),uVar119);
  sVar81 = CONCAT11((char)uVar61,(char)uVar61);
  uVar75 = CONCAT62(uVar38,sVar81);
  auVar134._8_4_ = 0;
  auVar134._0_8_ = uVar75;
  auVar134._12_2_ = uVar120;
  auVar134._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar63 >> 0x20);
  auVar133._12_4_ = auVar134._12_4_;
  auVar133._8_2_ = 0;
  auVar133._0_8_ = uVar75;
  auVar133._10_2_ = uVar120;
  auVar132._10_6_ = auVar133._10_6_;
  auVar132._8_2_ = uVar120;
  auVar132._0_8_ = uVar75;
  uVar120 = (undefined2)uVar38;
  auVar42._4_8_ = auVar132._8_8_;
  auVar42._2_2_ = uVar120;
  auVar42._0_2_ = uVar120;
  fVar83 = (float)((int)sVar81 >> 8);
  fVar122 = (float)(auVar42._0_4_ >> 0x18);
  fVar124 = (float)(auVar132._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar119 = (undefined1)((uint)uVar61 >> 0x18);
  uVar120 = CONCAT11(uVar119,uVar119);
  uVar119 = (undefined1)((uint)uVar61 >> 0x10);
  uVar63 = CONCAT35(CONCAT21(uVar120,uVar119),CONCAT14(uVar119,uVar61));
  uVar119 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar63 >> 0x20),uVar119),uVar119);
  sVar81 = CONCAT11((char)uVar61,(char)uVar61);
  uVar75 = CONCAT62(uVar38,sVar81);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar75;
  auVar209._12_2_ = uVar120;
  auVar209._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar63 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar75;
  auVar208._10_2_ = uVar120;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar120;
  auVar207._0_8_ = uVar75;
  uVar120 = (undefined2)uVar38;
  auVar43._4_8_ = auVar207._8_8_;
  auVar43._2_2_ = uVar120;
  auVar43._0_2_ = uVar120;
  fVar246 = (float)((int)sVar81 >> 8);
  fVar256 = (float)(auVar43._0_4_ >> 0x18);
  fVar257 = (float)(auVar207._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar62 + 6);
  uVar119 = (undefined1)((uint)uVar61 >> 0x18);
  uVar120 = CONCAT11(uVar119,uVar119);
  uVar119 = (undefined1)((uint)uVar61 >> 0x10);
  uVar63 = CONCAT35(CONCAT21(uVar120,uVar119),CONCAT14(uVar119,uVar61));
  uVar119 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar63 >> 0x20),uVar119),uVar119);
  sVar81 = CONCAT11((char)uVar61,(char)uVar61);
  uVar75 = CONCAT62(uVar38,sVar81);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar75;
  auVar212._12_2_ = uVar120;
  auVar212._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar63 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar75;
  auVar211._10_2_ = uVar120;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar120;
  auVar210._0_8_ = uVar75;
  uVar120 = (undefined2)uVar38;
  auVar44._4_8_ = auVar210._8_8_;
  auVar44._2_2_ = uVar120;
  auVar44._0_2_ = uVar120;
  fVar265 = (float)((int)sVar81 >> 8);
  fVar274 = (float)(auVar44._0_4_ >> 0x18);
  fVar275 = (float)(auVar210._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 0x1a + 6);
  uVar119 = (undefined1)((uint)uVar61 >> 0x18);
  uVar120 = CONCAT11(uVar119,uVar119);
  uVar119 = (undefined1)((uint)uVar61 >> 0x10);
  uVar63 = CONCAT35(CONCAT21(uVar120,uVar119),CONCAT14(uVar119,uVar61));
  uVar119 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar63 >> 0x20),uVar119),uVar119);
  sVar81 = CONCAT11((char)uVar61,(char)uVar61);
  uVar75 = CONCAT62(uVar38,sVar81);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar75;
  auVar215._12_2_ = uVar120;
  auVar215._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar63 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar75;
  auVar214._10_2_ = uVar120;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar120;
  auVar213._0_8_ = uVar75;
  uVar120 = (undefined2)uVar38;
  auVar45._4_8_ = auVar213._8_8_;
  auVar45._2_2_ = uVar120;
  auVar45._0_2_ = uVar120;
  fVar258 = (float)((int)sVar81 >> 8);
  fVar263 = (float)(auVar45._0_4_ >> 0x18);
  fVar264 = (float)(auVar213._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 0x1b + 6);
  uVar119 = (undefined1)((uint)uVar61 >> 0x18);
  uVar120 = CONCAT11(uVar119,uVar119);
  uVar119 = (undefined1)((uint)uVar61 >> 0x10);
  uVar63 = CONCAT35(CONCAT21(uVar120,uVar119),CONCAT14(uVar119,uVar61));
  uVar119 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar63 >> 0x20),uVar119),uVar119);
  sVar81 = CONCAT11((char)uVar61,(char)uVar61);
  uVar75 = CONCAT62(uVar38,sVar81);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar75;
  auVar218._12_2_ = uVar120;
  auVar218._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar63 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar75;
  auVar217._10_2_ = uVar120;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar120;
  auVar216._0_8_ = uVar75;
  uVar120 = (undefined2)uVar38;
  auVar46._4_8_ = auVar216._8_8_;
  auVar46._2_2_ = uVar120;
  auVar46._0_2_ = uVar120;
  fVar278 = (float)((int)sVar81 >> 8);
  fVar288 = (float)(auVar46._0_4_ >> 0x18);
  fVar290 = (float)(auVar216._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 0x1c + 6);
  uVar119 = (undefined1)((uint)uVar61 >> 0x18);
  uVar120 = CONCAT11(uVar119,uVar119);
  uVar119 = (undefined1)((uint)uVar61 >> 0x10);
  uVar63 = CONCAT35(CONCAT21(uVar120,uVar119),CONCAT14(uVar119,uVar61));
  uVar119 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar63 >> 0x20),uVar119),uVar119);
  sVar81 = CONCAT11((char)uVar61,(char)uVar61);
  uVar75 = CONCAT62(uVar38,sVar81);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar75;
  auVar221._12_2_ = uVar120;
  auVar221._14_2_ = uVar120;
  uVar120 = (undefined2)((ulong)uVar63 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar75;
  auVar220._10_2_ = uVar120;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar120;
  auVar219._0_8_ = uVar75;
  uVar120 = (undefined2)uVar38;
  auVar47._4_8_ = auVar219._8_8_;
  auVar47._2_2_ = uVar120;
  auVar47._0_2_ = uVar120;
  fVar317 = (float)((int)sVar81 >> 8);
  fVar321 = (float)(auVar47._0_4_ >> 0x18);
  fVar322 = (float)(auVar219._8_4_ >> 0x18);
  fVar303 = fVar161 * fVar82 + fVar174 * fVar201 + fVar175 * fVar233;
  fVar314 = fVar161 * fVar121 + fVar174 * fVar204 + fVar175 * fVar244;
  fVar315 = fVar161 * fVar123 + fVar174 * fVar205 + fVar175 * fVar245;
  fVar316 = fVar161 * (float)(auVar164._12_4_ >> 0x18) +
            fVar174 * (float)(auVar127._12_4_ >> 0x18) + fVar175 * (float)(auVar130._12_4_ >> 0x18);
  fVar293 = fVar161 * fVar83 + fVar174 * fVar246 + fVar175 * fVar265;
  fVar300 = fVar161 * fVar122 + fVar174 * fVar256 + fVar175 * fVar274;
  fVar301 = fVar161 * fVar124 + fVar174 * fVar257 + fVar175 * fVar275;
  fVar302 = fVar161 * (float)(auVar133._12_4_ >> 0x18) +
            fVar174 * (float)(auVar208._12_4_ >> 0x18) + fVar175 * (float)(auVar211._12_4_ >> 0x18);
  fVar206 = fVar161 * fVar258 + fVar174 * fVar278 + fVar175 * fVar317;
  fVar231 = fVar161 * fVar263 + fVar174 * fVar288 + fVar175 * fVar321;
  fVar232 = fVar161 * fVar264 + fVar174 * fVar290 + fVar175 * fVar322;
  fVar161 = fVar161 * (float)(auVar214._12_4_ >> 0x18) +
            fVar174 * (float)(auVar217._12_4_ >> 0x18) + fVar175 * (float)(auVar220._12_4_ >> 0x18);
  fVar125 = fVar82 * fVar177 + fVar201 * fVar199 + fVar233 * fVar200;
  fVar158 = fVar121 * fVar177 + fVar204 * fVar199 + fVar244 * fVar200;
  fVar159 = fVar123 * fVar177 + fVar205 * fVar199 + fVar245 * fVar200;
  fVar160 = (float)(auVar164._12_4_ >> 0x18) * fVar177 +
            (float)(auVar127._12_4_ >> 0x18) * fVar199 + (float)(auVar130._12_4_ >> 0x18) * fVar200;
  fVar162 = fVar83 * fVar177 + fVar246 * fVar199 + fVar265 * fVar200;
  fVar274 = fVar122 * fVar177 + fVar256 * fVar199 + fVar274 * fVar200;
  fVar275 = fVar124 * fVar177 + fVar257 * fVar199 + fVar275 * fVar200;
  fVar176 = (float)(auVar133._12_4_ >> 0x18) * fVar177 +
            (float)(auVar208._12_4_ >> 0x18) * fVar199 + (float)(auVar211._12_4_ >> 0x18) * fVar200;
  fVar175 = fVar177 * fVar258 + fVar199 * fVar278 + fVar200 * fVar317;
  fVar122 = fVar177 * fVar263 + fVar199 * fVar288 + fVar200 * fVar321;
  fVar205 = fVar177 * fVar264 + fVar199 * fVar290 + fVar200 * fVar322;
  fVar258 = fVar177 * (float)(auVar214._12_4_ >> 0x18) +
            fVar199 * (float)(auVar217._12_4_ >> 0x18) + fVar200 * (float)(auVar220._12_4_ >> 0x18);
  fVar82 = (float)DAT_01f80d30;
  fVar83 = DAT_01f80d30._4_4_;
  fVar121 = DAT_01f80d30._8_4_;
  fVar123 = DAT_01f80d30._12_4_;
  uVar77 = -(uint)(fVar82 <= ABS(fVar303));
  uVar78 = -(uint)(fVar83 <= ABS(fVar314));
  uVar79 = -(uint)(fVar121 <= ABS(fVar315));
  uVar80 = -(uint)(fVar123 <= ABS(fVar316));
  auVar304._0_4_ = (uint)fVar303 & uVar77;
  auVar304._4_4_ = (uint)fVar314 & uVar78;
  auVar304._8_4_ = (uint)fVar315 & uVar79;
  auVar304._12_4_ = (uint)fVar316 & uVar80;
  auVar178._0_4_ = ~uVar77 & (uint)fVar82;
  auVar178._4_4_ = ~uVar78 & (uint)fVar83;
  auVar178._8_4_ = ~uVar79 & (uint)fVar121;
  auVar178._12_4_ = ~uVar80 & (uint)fVar123;
  auVar178 = auVar178 | auVar304;
  uVar77 = -(uint)(fVar82 <= ABS(fVar293));
  uVar78 = -(uint)(fVar83 <= ABS(fVar300));
  uVar79 = -(uint)(fVar121 <= ABS(fVar301));
  uVar80 = -(uint)(fVar123 <= ABS(fVar302));
  auVar294._0_4_ = (uint)fVar293 & uVar77;
  auVar294._4_4_ = (uint)fVar300 & uVar78;
  auVar294._8_4_ = (uint)fVar301 & uVar79;
  auVar294._12_4_ = (uint)fVar302 & uVar80;
  auVar234._0_4_ = ~uVar77 & (uint)fVar82;
  auVar234._4_4_ = ~uVar78 & (uint)fVar83;
  auVar234._8_4_ = ~uVar79 & (uint)fVar121;
  auVar234._12_4_ = ~uVar80 & (uint)fVar123;
  auVar234 = auVar234 | auVar294;
  uVar77 = -(uint)(fVar82 <= ABS(fVar206));
  uVar78 = -(uint)(fVar83 <= ABS(fVar231));
  uVar79 = -(uint)(fVar121 <= ABS(fVar232));
  uVar80 = -(uint)(fVar123 <= ABS(fVar161));
  auVar222._0_4_ = (uint)fVar206 & uVar77;
  auVar222._4_4_ = (uint)fVar231 & uVar78;
  auVar222._8_4_ = (uint)fVar232 & uVar79;
  auVar222._12_4_ = (uint)fVar161 & uVar80;
  auVar247._0_4_ = ~uVar77 & (uint)fVar82;
  auVar247._4_4_ = ~uVar78 & (uint)fVar83;
  auVar247._8_4_ = ~uVar79 & (uint)fVar121;
  auVar247._12_4_ = ~uVar80 & (uint)fVar123;
  auVar247 = auVar247 | auVar222;
  auVar84 = rcpps(_DAT_01f80d30,auVar178);
  fVar82 = auVar84._0_4_;
  fVar123 = auVar84._4_4_;
  fVar206 = auVar84._8_4_;
  fVar263 = auVar84._12_4_;
  fVar82 = (1.0 - auVar178._0_4_ * fVar82) * fVar82 + fVar82;
  fVar123 = (1.0 - auVar178._4_4_ * fVar123) * fVar123 + fVar123;
  fVar206 = (1.0 - auVar178._8_4_ * fVar206) * fVar206 + fVar206;
  fVar263 = (1.0 - auVar178._12_4_ * fVar263) * fVar263 + fVar263;
  auVar84 = rcpps(auVar84,auVar234);
  fVar83 = auVar84._0_4_;
  fVar124 = auVar84._4_4_;
  fVar231 = auVar84._8_4_;
  fVar264 = auVar84._12_4_;
  fVar83 = (1.0 - auVar234._0_4_ * fVar83) * fVar83 + fVar83;
  fVar124 = (1.0 - auVar234._4_4_ * fVar124) * fVar124 + fVar124;
  fVar231 = (1.0 - auVar234._8_4_ * fVar231) * fVar231 + fVar231;
  fVar264 = (1.0 - auVar234._12_4_ * fVar264) * fVar264 + fVar264;
  auVar84 = rcpps(auVar84,auVar247);
  fVar121 = auVar84._0_4_;
  fVar161 = auVar84._4_4_;
  fVar232 = auVar84._8_4_;
  fVar265 = auVar84._12_4_;
  fVar121 = (1.0 - auVar247._0_4_ * fVar121) * fVar121 + fVar121;
  fVar161 = (1.0 - auVar247._4_4_ * fVar161) * fVar161 + fVar161;
  fVar232 = (1.0 - auVar247._8_4_ * fVar232) * fVar232 + fVar232;
  fVar265 = (1.0 - auVar247._12_4_ * fVar265) * fVar265 + fVar265;
  fVar278 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar67 + 0x16)) *
            *(float *)(prim + lVar67 + 0x1a);
  uVar75 = *(ulong *)(prim + uVar62 * 7 + 6);
  uVar120 = (undefined2)(uVar75 >> 0x30);
  auVar236._8_4_ = 0;
  auVar236._0_8_ = uVar75;
  auVar236._12_2_ = uVar120;
  auVar236._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar75 >> 0x20);
  auVar85._12_4_ = auVar236._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar75;
  auVar85._10_2_ = uVar120;
  auVar239._10_6_ = auVar85._10_6_;
  auVar239._8_2_ = uVar120;
  auVar239._0_8_ = uVar75;
  uVar120 = (undefined2)(uVar75 >> 0x10);
  auVar48._4_8_ = auVar239._8_8_;
  auVar48._2_2_ = uVar120;
  auVar48._0_2_ = uVar120;
  fVar174 = (float)(auVar48._0_4_ >> 0x10);
  fVar233 = (float)(auVar239._8_4_ >> 0x10);
  uVar73 = *(ulong *)(prim + uVar62 * 0xb + 6);
  uVar120 = (undefined2)(uVar73 >> 0x30);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar73;
  auVar181._12_2_ = uVar120;
  auVar181._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar73 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar73;
  auVar180._10_2_ = uVar120;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar120;
  auVar179._0_8_ = uVar73;
  uVar120 = (undefined2)(uVar73 >> 0x10);
  auVar49._4_8_ = auVar179._8_8_;
  auVar49._2_2_ = uVar120;
  auVar49._0_2_ = uVar120;
  uVar9 = *(ulong *)(prim + uVar62 * 9 + 6);
  uVar120 = (undefined2)(uVar9 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar9;
  auVar88._12_2_ = uVar120;
  auVar88._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar9 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar9;
  auVar87._10_2_ = uVar120;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar120;
  auVar86._0_8_ = uVar9;
  uVar120 = (undefined2)(uVar9 >> 0x10);
  auVar50._4_8_ = auVar86._8_8_;
  auVar50._2_2_ = uVar120;
  auVar50._0_2_ = uVar120;
  fVar177 = (float)(auVar50._0_4_ >> 0x10);
  fVar244 = (float)(auVar86._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar62 * 0xd + 6);
  uVar120 = (undefined2)(uVar10 >> 0x30);
  auVar250._8_4_ = 0;
  auVar250._0_8_ = uVar10;
  auVar250._12_2_ = uVar120;
  auVar250._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar10 >> 0x20);
  auVar249._12_4_ = auVar250._12_4_;
  auVar249._8_2_ = 0;
  auVar249._0_8_ = uVar10;
  auVar249._10_2_ = uVar120;
  auVar248._10_6_ = auVar249._10_6_;
  auVar248._8_2_ = uVar120;
  auVar248._0_8_ = uVar10;
  uVar120 = (undefined2)(uVar10 >> 0x10);
  auVar51._4_8_ = auVar248._8_8_;
  auVar51._2_2_ = uVar120;
  auVar51._0_2_ = uVar120;
  uVar11 = *(ulong *)(prim + uVar62 * 0x12 + 6);
  uVar120 = (undefined2)(uVar11 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar11;
  auVar91._12_2_ = uVar120;
  auVar91._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar11 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar11;
  auVar90._10_2_ = uVar120;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar120;
  auVar89._0_8_ = uVar11;
  uVar120 = (undefined2)(uVar11 >> 0x10);
  auVar52._4_8_ = auVar89._8_8_;
  auVar52._2_2_ = uVar120;
  auVar52._0_2_ = uVar120;
  fVar199 = (float)(auVar52._0_4_ >> 0x10);
  fVar245 = (float)(auVar89._8_4_ >> 0x10);
  uVar70 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar62 * 2 + uVar70 + 6);
  uVar120 = (undefined2)(uVar12 >> 0x30);
  auVar268._8_4_ = 0;
  auVar268._0_8_ = uVar12;
  auVar268._12_2_ = uVar120;
  auVar268._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar12 >> 0x20);
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._8_2_ = 0;
  auVar267._0_8_ = uVar12;
  auVar267._10_2_ = uVar120;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._8_2_ = uVar120;
  auVar266._0_8_ = uVar12;
  uVar120 = (undefined2)(uVar12 >> 0x10);
  auVar53._4_8_ = auVar266._8_8_;
  auVar53._2_2_ = uVar120;
  auVar53._0_2_ = uVar120;
  uVar70 = *(ulong *)(prim + uVar70 + 6);
  uVar120 = (undefined2)(uVar70 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar70;
  auVar94._12_2_ = uVar120;
  auVar94._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar70 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar70;
  auVar93._10_2_ = uVar120;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar120;
  auVar92._0_8_ = uVar70;
  uVar120 = (undefined2)(uVar70 >> 0x10);
  auVar54._4_8_ = auVar92._8_8_;
  auVar54._2_2_ = uVar120;
  auVar54._0_2_ = uVar120;
  fVar200 = (float)(auVar54._0_4_ >> 0x10);
  fVar246 = (float)(auVar92._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar62 * 0x18 + 6);
  uVar120 = (undefined2)(uVar13 >> 0x30);
  auVar282._8_4_ = 0;
  auVar282._0_8_ = uVar13;
  auVar282._12_2_ = uVar120;
  auVar282._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar13 >> 0x20);
  auVar281._12_4_ = auVar282._12_4_;
  auVar281._8_2_ = 0;
  auVar281._0_8_ = uVar13;
  auVar281._10_2_ = uVar120;
  auVar280._10_6_ = auVar281._10_6_;
  auVar280._8_2_ = uVar120;
  auVar280._0_8_ = uVar13;
  uVar120 = (undefined2)(uVar13 >> 0x10);
  auVar55._4_8_ = auVar280._8_8_;
  auVar55._2_2_ = uVar120;
  auVar55._0_2_ = uVar120;
  uVar14 = *(ulong *)(prim + uVar62 * 0x1d + 6);
  uVar120 = (undefined2)(uVar14 >> 0x30);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar14;
  auVar97._12_2_ = uVar120;
  auVar97._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar14 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar14;
  auVar96._10_2_ = uVar120;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar120;
  auVar95._0_8_ = uVar14;
  uVar120 = (undefined2)(uVar14 >> 0x10);
  auVar56._4_8_ = auVar95._8_8_;
  auVar56._2_2_ = uVar120;
  auVar56._0_2_ = uVar120;
  fVar201 = (float)(auVar56._0_4_ >> 0x10);
  fVar256 = (float)(auVar95._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar62 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar120 = (undefined2)(uVar15 >> 0x30);
  auVar297._8_4_ = 0;
  auVar297._0_8_ = uVar15;
  auVar297._12_2_ = uVar120;
  auVar297._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar15 >> 0x20);
  auVar296._12_4_ = auVar297._12_4_;
  auVar296._8_2_ = 0;
  auVar296._0_8_ = uVar15;
  auVar296._10_2_ = uVar120;
  auVar295._10_6_ = auVar296._10_6_;
  auVar295._8_2_ = uVar120;
  auVar295._0_8_ = uVar15;
  uVar120 = (undefined2)(uVar15 >> 0x10);
  auVar57._4_8_ = auVar295._8_8_;
  auVar57._2_2_ = uVar120;
  auVar57._0_2_ = uVar120;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar62) + 6);
  uVar120 = (undefined2)(uVar16 >> 0x30);
  auVar100._8_4_ = 0;
  auVar100._0_8_ = uVar16;
  auVar100._12_2_ = uVar120;
  auVar100._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar16 >> 0x20);
  auVar99._12_4_ = auVar100._12_4_;
  auVar99._8_2_ = 0;
  auVar99._0_8_ = uVar16;
  auVar99._10_2_ = uVar120;
  auVar98._10_6_ = auVar99._10_6_;
  auVar98._8_2_ = uVar120;
  auVar98._0_8_ = uVar16;
  uVar120 = (undefined2)(uVar16 >> 0x10);
  auVar58._4_8_ = auVar98._8_8_;
  auVar58._2_2_ = uVar120;
  auVar58._0_2_ = uVar120;
  fVar204 = (float)(auVar58._0_4_ >> 0x10);
  fVar257 = (float)(auVar98._8_4_ >> 0x10);
  uVar62 = *(ulong *)(prim + uVar62 * 0x23 + 6);
  uVar120 = (undefined2)(uVar62 >> 0x30);
  auVar307._8_4_ = 0;
  auVar307._0_8_ = uVar62;
  auVar307._12_2_ = uVar120;
  auVar307._14_2_ = uVar120;
  uVar120 = (undefined2)(uVar62 >> 0x20);
  auVar306._12_4_ = auVar307._12_4_;
  auVar306._8_2_ = 0;
  auVar306._0_8_ = uVar62;
  auVar306._10_2_ = uVar120;
  auVar305._10_6_ = auVar306._10_6_;
  auVar305._8_2_ = uVar120;
  auVar305._0_8_ = uVar62;
  uVar120 = (undefined2)(uVar62 >> 0x10);
  auVar59._4_8_ = auVar305._8_8_;
  auVar59._2_2_ = uVar120;
  auVar59._0_2_ = uVar120;
  auVar182._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar174) * fVar278 + fVar174) - fVar158) *
                fVar123,((((float)(int)(short)uVar73 - (float)(int)(short)uVar75) * fVar278 +
                         (float)(int)(short)uVar75) - fVar125) * fVar82);
  auVar182._8_4_ =
       ((((float)(auVar179._8_4_ >> 0x10) - fVar233) * fVar278 + fVar233) - fVar159) * fVar206;
  auVar182._12_4_ =
       ((((float)(auVar180._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar160) * fVar263;
  auVar251._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar278 + (float)(int)(short)uVar9
        ) - fVar125) * fVar82;
  auVar251._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar177) * fVar278 + fVar177) - fVar158) * fVar123;
  auVar251._8_4_ =
       ((((float)(auVar248._8_4_ >> 0x10) - fVar244) * fVar278 + fVar244) - fVar159) * fVar206;
  auVar251._12_4_ =
       ((((float)(auVar249._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar160) * fVar263;
  auVar269._0_8_ =
       CONCAT44(((((float)(auVar53._0_4_ >> 0x10) - fVar199) * fVar278 + fVar199) - fVar274) *
                fVar124,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar278 +
                         (float)(int)(short)uVar11) - fVar162) * fVar83);
  auVar269._8_4_ =
       ((((float)(auVar266._8_4_ >> 0x10) - fVar245) * fVar278 + fVar245) - fVar275) * fVar231;
  auVar269._12_4_ =
       ((((float)(auVar267._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar176) * fVar264;
  auVar283._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar70) * fVar278 +
        (float)(int)(short)uVar70) - fVar162) * fVar83;
  auVar283._4_4_ =
       ((((float)(auVar55._0_4_ >> 0x10) - fVar200) * fVar278 + fVar200) - fVar274) * fVar124;
  auVar283._8_4_ =
       ((((float)(auVar280._8_4_ >> 0x10) - fVar246) * fVar278 + fVar246) - fVar275) * fVar231;
  auVar283._12_4_ =
       ((((float)(auVar281._12_4_ >> 0x10) - (float)(auVar93._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar93._12_4_ >> 0x10)) - fVar176) * fVar264;
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar298._0_8_ =
       CONCAT44(((((float)(auVar57._0_4_ >> 0x10) - fVar201) * fVar278 + fVar201) - fVar122) *
                fVar161,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar278 +
                         (float)(int)(short)uVar14) - fVar175) * fVar121);
  auVar298._8_4_ =
       ((((float)(auVar295._8_4_ >> 0x10) - fVar256) * fVar278 + fVar256) - fVar205) * fVar232;
  auVar298._12_4_ =
       ((((float)(auVar296._12_4_ >> 0x10) - (float)(auVar96._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar96._12_4_ >> 0x10)) - fVar258) * fVar265;
  auVar308._0_4_ =
       ((((float)(int)(short)uVar62 - (float)(int)(short)uVar16) * fVar278 +
        (float)(int)(short)uVar16) - fVar175) * fVar121;
  auVar308._4_4_ =
       ((((float)(auVar59._0_4_ >> 0x10) - fVar204) * fVar278 + fVar204) - fVar122) * fVar161;
  auVar308._8_4_ =
       ((((float)(auVar305._8_4_ >> 0x10) - fVar257) * fVar278 + fVar257) - fVar205) * fVar232;
  auVar308._12_4_ =
       ((((float)(auVar306._12_4_ >> 0x10) - (float)(auVar99._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar99._12_4_ >> 0x10)) - fVar258) * fVar265;
  auVar163._8_4_ = auVar182._8_4_;
  auVar163._0_8_ = auVar182._0_8_;
  auVar163._12_4_ = auVar182._12_4_;
  auVar164 = minps(auVar163,auVar251);
  auVar135._8_4_ = auVar269._8_4_;
  auVar135._0_8_ = auVar269._0_8_;
  auVar135._12_4_ = auVar269._12_4_;
  auVar84 = minps(auVar135,auVar283);
  auVar164 = maxps(auVar164,auVar84);
  auVar136._8_4_ = auVar298._8_4_;
  auVar136._0_8_ = auVar298._0_8_;
  auVar136._12_4_ = auVar298._12_4_;
  auVar84 = minps(auVar136,auVar308);
  auVar101._4_4_ = uVar61;
  auVar101._0_4_ = uVar61;
  auVar101._8_4_ = uVar61;
  auVar101._12_4_ = uVar61;
  auVar84 = maxps(auVar84,auVar101);
  auVar84 = maxps(auVar164,auVar84);
  auVar164 = maxps(auVar182,auVar251);
  auVar270 = maxps(auVar269,auVar283);
  auVar164 = minps(auVar164,auVar270);
  local_208 = auVar84._0_4_ * 0.99999964;
  fStack_204 = auVar84._4_4_ * 0.99999964;
  fStack_200 = auVar84._8_4_ * 0.99999964;
  fStack_1fc = auVar84._12_4_ * 0.99999964;
  auVar84 = maxps(auVar298,auVar308);
  uVar61 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar102._4_4_ = uVar61;
  auVar102._0_4_ = uVar61;
  auVar102._8_4_ = uVar61;
  auVar102._12_4_ = uVar61;
  auVar84 = minps(auVar84,auVar102);
  auVar84 = minps(auVar164,auVar84);
  uVar77 = (uint)(byte)PVar17;
  auVar137._0_4_ = -(uint)(uVar77 != 0 && local_208 <= auVar84._0_4_ * 1.0000004);
  auVar137._4_4_ = -(uint)(1 < uVar77 && fStack_204 <= auVar84._4_4_ * 1.0000004);
  auVar137._8_4_ = -(uint)(2 < uVar77 && fStack_200 <= auVar84._8_4_ * 1.0000004);
  auVar137._12_4_ = -(uint)(3 < uVar77 && fStack_1fc <= auVar84._12_4_ * 1.0000004);
  uVar77 = movmskps(uVar77,auVar137);
  if (uVar77 == 0) {
    return false;
  }
  uVar77 = uVar77 & 0xff;
  local_1b8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1b8._12_4_ = 0;
  local_468 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_3b8 = prim;
LAB_00b4124d:
  local_3b0 = (ulong)uVar77;
  lVar67 = 0;
  if (local_3b0 != 0) {
    for (; (uVar77 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
    }
  }
  uVar77 = *(uint *)(local_3b8 + 2);
  uVar78 = *(uint *)(local_3b8 + lVar67 * 4 + 6);
  pGVar18 = (context->scene->geometries).items[uVar77].ptr;
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                           (ulong)uVar78 *
                           pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar175 = pGVar18->fnumTimeSegments;
  fVar82 = (pGVar18->time_range).lower;
  fVar82 = ((*(float *)(ray + k * 4 + 0x70) - fVar82) / ((pGVar18->time_range).upper - fVar82)) *
           fVar175;
  _local_548 = ZEXT416((uint)fVar82);
  fVar82 = floorf(fVar82);
  fVar175 = fVar175 + -1.0;
  if (fVar175 <= fVar82) {
    fVar82 = fVar175;
  }
  fVar175 = 0.0;
  if (0.0 <= fVar82) {
    fVar175 = fVar82;
  }
  fVar177 = (float)local_548._0_4_ - fVar175;
  fVar83 = 1.0 - fVar177;
  _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar72 = (long)(int)fVar175 * 0x38;
  lVar67 = *(long *)(_Var19 + lVar72);
  lVar20 = *(long *)(_Var19 + 0x10 + lVar72);
  pfVar1 = (float *)(lVar67 + lVar20 * uVar75);
  pfVar2 = (float *)(lVar67 + lVar20 * (uVar75 + 1));
  pfVar3 = (float *)(lVar67 + lVar20 * (uVar75 + 2));
  pfVar4 = (float *)(lVar67 + lVar20 * (uVar75 + 3));
  lVar67 = *(long *)(_Var19 + 0x38 + lVar72);
  lVar20 = *(long *)(_Var19 + 0x48 + lVar72);
  pRVar69 = (RTCIntersectArguments *)(lVar20 * (uVar75 + 3));
  pfVar5 = (float *)(lVar67 + uVar75 * lVar20);
  pfVar6 = (float *)(lVar67 + (uVar75 + 1) * lVar20);
  pfVar7 = (float *)(lVar67 + (uVar75 + 2) * lVar20);
  local_2c8 = *pfVar1 * fVar83 + *pfVar5 * fVar177;
  local_158 = pfVar1[1] * fVar83 + pfVar5[1] * fVar177;
  local_2d8 = pfVar1[2] * fVar83 + pfVar5[2] * fVar177;
  local_2e8 = *pfVar2 * fVar83 + *pfVar6 * fVar177;
  local_2f8 = pfVar2[1] * fVar83 + pfVar6[1] * fVar177;
  local_308 = pfVar2[2] * fVar83 + pfVar6[2] * fVar177;
  fVar175 = *(float *)(ray + k * 4 + 0x40);
  fVar82 = *(float *)(ray + k * 4 + 0x50);
  fVar121 = *(float *)(ray + k * 4 + 0x60);
  fVar122 = fVar82 * fVar82;
  fVar124 = fVar121 * fVar121;
  fVar123 = fVar122 + fVar175 * fVar175 + fVar124;
  auVar138._0_8_ = CONCAT44(fVar122 + fVar122 + 0.0,fVar123);
  auVar138._8_4_ = fVar122 + fVar124 + fVar124;
  auVar138._12_4_ = fVar122 + 0.0 + 0.0;
  auVar235._8_4_ = auVar138._8_4_;
  auVar235._0_8_ = auVar138._0_8_;
  auVar235._12_4_ = auVar138._12_4_;
  auVar84 = rcpss(auVar235,auVar138);
  fVar174 = (2.0 - auVar84._0_4_ * fVar123) * auVar84._0_4_ *
            (((local_2d8 + local_308) * 0.5 - *(float *)(ray + k * 4 + 0x20)) * fVar121 +
            ((local_158 + local_2f8) * 0.5 - *(float *)(ray + k * 4 + 0x10)) * fVar82 +
            ((local_2c8 + local_2e8) * 0.5 - *(float *)(ray + k * 4)) * fVar175);
  local_588 = fVar175 * fVar174 + *(float *)(ray + k * 4);
  fVar161 = fVar82 * fVar174 + *(float *)(ray + k * 4 + 0x10);
  local_358 = fVar121 * fVar174 + *(float *)(ray + k * 4 + 0x20);
  local_2c8 = local_2c8 - local_588;
  local_158 = local_158 - fVar161;
  local_2d8 = local_2d8 - local_358;
  fStack_41c = (pfVar1[3] * fVar83 + pfVar5[3] * fVar177) - 0.0;
  local_328 = (*pfVar3 * fVar83 + *pfVar7 * fVar177) - local_588;
  fStack_444 = (pfVar3[1] * fVar83 + pfVar7[1] * fVar177) - fVar161;
  local_338 = (pfVar3[2] * fVar83 + pfVar7[2] * fVar177) - local_358;
  fStack_43c = (pfVar3[3] * fVar83 + pfVar7[3] * fVar177) - 0.0;
  pfVar1 = (float *)((long)&pRVar69->flags + lVar67);
  local_2e8 = local_2e8 - local_588;
  local_2f8 = local_2f8 - fVar161;
  local_308 = local_308 - local_358;
  fStack_42c = (pfVar2[3] * fVar83 + pfVar6[3] * fVar177) - 0.0;
  local_588 = (fVar177 * *pfVar1 + fVar83 * *pfVar4) - local_588;
  fVar161 = (fVar177 * pfVar1[1] + fVar83 * pfVar4[1]) - fVar161;
  local_358 = (fVar177 * pfVar1[2] + fVar83 * pfVar4[2]) - local_358;
  fStack_53c = (fVar177 * pfVar1[3] + fVar83 * pfVar4[3]) - 0.0;
  fStack_2c4 = local_2c8;
  fStack_2c0 = local_2c8;
  fStack_2bc = local_2c8;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  fStack_2d4 = local_2d8;
  fStack_2d0 = local_2d8;
  fStack_2cc = local_2d8;
  local_428 = local_2c8;
  fStack_424 = local_158;
  fStack_420 = local_2d8;
  local_168 = fStack_41c;
  fStack_164 = fStack_41c;
  fStack_160 = fStack_41c;
  fStack_15c = fStack_41c;
  fVar83 = fVar82 * fVar82;
  fStack_2e4 = local_2e8;
  fStack_2e0 = local_2e8;
  fStack_2dc = local_2e8;
  fStack_13c = fVar175 * fVar175;
  local_148 = fStack_13c + fVar83 + fVar124;
  fStack_144 = fStack_13c + fVar83 + fVar124;
  fStack_140 = fStack_13c + fVar83 + fVar124;
  fStack_13c = fStack_13c + fVar83 + fVar124;
  fStack_2f4 = local_2f8;
  fStack_2f0 = local_2f8;
  fStack_2ec = local_2f8;
  fStack_304 = local_308;
  fStack_300 = local_308;
  fStack_2fc = local_308;
  local_438 = local_2e8;
  fStack_434 = local_2f8;
  fStack_430 = local_308;
  local_318 = fStack_42c;
  fStack_314 = fStack_42c;
  fStack_310 = fStack_42c;
  fStack_30c = fStack_42c;
  fStack_324 = local_328;
  fStack_320 = local_328;
  fStack_31c = local_328;
  fStack_334 = local_338;
  fStack_330 = local_338;
  fStack_32c = local_338;
  local_448 = local_328;
  fStack_440 = local_338;
  local_348 = fStack_43c;
  fStack_344 = fStack_43c;
  fStack_340 = fStack_43c;
  fStack_33c = fStack_43c;
  fStack_354 = local_358;
  fStack_350 = local_358;
  fStack_34c = local_358;
  local_548._4_4_ = fVar161;
  local_548._0_4_ = local_588;
  fStack_540 = local_358;
  local_368 = fStack_53c;
  fStack_364 = fStack_53c;
  fStack_360 = fStack_53c;
  fStack_35c = fStack_53c;
  local_578 = *(float *)(ray + k * 4 + 0x40);
  fStack_564 = fVar82;
  local_568 = fVar82;
  fStack_560 = fVar82;
  fStack_55c = fVar82;
  local_378 = ABS(local_148);
  fStack_374 = ABS(fStack_144);
  fStack_370 = ABS(fStack_140);
  fStack_36c = ABS(fStack_13c);
  fVar83 = *(float *)(ray + k * 4 + 0x30);
  local_3e8 = ZEXT416((uint)fVar174);
  local_1a8 = fVar83 - fVar174;
  fStack_1a4 = local_1a8;
  fStack_1a0 = local_1a8;
  fStack_19c = local_1a8;
  local_460 = (ulong)uVar77;
  local_398 = uVar77;
  uStack_394 = uVar77;
  uStack_390 = uVar77;
  uStack_38c = uVar77;
  local_3a8 = uVar78;
  uStack_3a4 = uVar78;
  uStack_3a0 = uVar78;
  uStack_39c = uVar78;
  uVar75 = 0;
  bVar71 = false;
  fVar122 = 1.4013e-45;
  local_198 = 0.0;
  fStack_194 = 1.0;
  local_458 = fStack_444;
  fStack_454 = fStack_444;
  fStack_450 = fStack_444;
  fStack_44c = fStack_444;
  fStack_584 = local_588;
  fStack_580 = local_588;
  fStack_57c = local_588;
  fStack_574 = local_578;
  fStack_570 = local_578;
  fStack_56c = local_578;
  do {
    uVar61 = SUB84(pRVar69,0);
    iVar74 = (int)uVar75;
    local_4f8._4_4_ = fStack_194 - local_198;
    uStack_190 = 0;
    uStack_18c = 0;
    local_4f8._0_4_ = local_4f8._4_4_;
    fStack_4f0 = (float)local_4f8._4_4_;
    fStack_4ec = (float)local_4f8._4_4_;
    local_598._4_4_ = local_198;
    local_598._0_4_ = local_198;
    fStack_590 = local_198;
    fStack_58c = local_198;
    fVar177 = (float)local_4f8._4_4_ * 0.0 + local_198;
    fVar199 = (float)local_4f8._4_4_ * 0.33333334 + local_198;
    fVar204 = (float)local_4f8._4_4_ * 0.6666667 + local_198;
    fVar206 = (float)local_4f8._4_4_ * 1.0 + local_198;
    fVar246 = 1.0 - fVar177;
    fVar158 = 1.0 - fVar199;
    fVar274 = 1.0 - fVar204;
    fVar288 = 1.0 - fVar206;
    fVar232 = fVar177 * 3.0;
    fVar233 = fVar199 * 3.0;
    fVar244 = fVar204 * 3.0;
    fVar245 = fVar206 * 3.0;
    fVar264 = ((fVar246 * 3.0 + -5.0) * fVar246 * fVar246 + 2.0) * 0.5;
    fVar265 = ((fVar158 * 3.0 + -5.0) * fVar158 * fVar158 + 2.0) * 0.5;
    fVar160 = ((fVar274 * 3.0 + -5.0) * fVar274 * fVar274 + 2.0) * 0.5;
    fVar162 = ((fVar288 * 3.0 + -5.0) * fVar288 * fVar288 + 2.0) * 0.5;
    fVar200 = -fVar246 * fVar177 * fVar177 * 0.5;
    fVar201 = -fVar158 * fVar199 * fVar199 * 0.5;
    fVar205 = -fVar274 * fVar204 * fVar204 * 0.5;
    fVar231 = -fVar288 * fVar206 * fVar206 * 0.5;
    fVar125 = (fVar177 * fVar177 * (fVar232 + -5.0) + 2.0) * 0.5;
    fVar159 = (fVar199 * fVar199 * (fVar233 + -5.0) + 2.0) * 0.5;
    fVar275 = (fVar204 * fVar204 * (fVar244 + -5.0) + 2.0) * 0.5;
    fVar176 = (fVar206 * fVar206 * (fVar245 + -5.0) + 2.0) * 0.5;
    fVar124 = (float)local_4f8._4_4_ * 0.11111111;
    fVar278 = -fVar177 * fVar246 * fVar246 * 0.5;
    fVar290 = -fVar199 * fVar158 * fVar158 * 0.5;
    fVar293 = -fVar204 * fVar274 * fVar274 * 0.5;
    fVar300 = -fVar206 * fVar288 * fVar288 * 0.5;
    fVar256 = local_2c8 * fVar278 + local_2e8 * fVar125 + local_328 * fVar264 + local_588 * fVar200;
    fVar257 = fStack_2c4 * fVar290 +
              fStack_2e4 * fVar159 + fStack_324 * fVar265 + fStack_584 * fVar201;
    fVar258 = fStack_2c0 * fVar293 +
              fStack_2e0 * fVar275 + fStack_320 * fVar160 + fStack_580 * fVar205;
    fVar263 = fStack_2bc * fVar300 +
              fStack_2dc * fVar176 + fStack_31c * fVar162 + fStack_57c * fVar231;
    fVar315 = local_158 * fVar278 + local_2f8 * fVar125 + local_458 * fVar264 + fVar161 * fVar200;
    fVar316 = fStack_154 * fVar290 + fStack_2f4 * fVar159 + fStack_454 * fVar265 + fVar161 * fVar201
    ;
    fVar317 = fStack_150 * fVar293 + fStack_2f0 * fVar275 + fStack_450 * fVar160 + fVar161 * fVar205
    ;
    fVar321 = fStack_14c * fVar300 + fStack_2ec * fVar176 + fStack_44c * fVar162 + fVar161 * fVar231
    ;
    fVar301 = local_2d8 * fVar278 + local_308 * fVar125 + local_338 * fVar264 + local_358 * fVar200;
    fVar302 = fStack_2d4 * fVar290 +
              fStack_304 * fVar159 + fStack_334 * fVar265 + fStack_354 * fVar201;
    fVar303 = fStack_2d0 * fVar293 +
              fStack_300 * fVar275 + fStack_330 * fVar160 + fStack_350 * fVar205;
    fVar314 = fStack_2cc * fVar300 +
              fStack_2fc * fVar176 + fStack_32c * fVar162 + fStack_34c * fVar231;
    fVar125 = fVar278 * local_168 + fVar125 * local_318 + fVar264 * local_348 + fVar200 * local_368;
    fVar159 = fVar290 * fStack_164 +
              fVar159 * fStack_314 + fVar265 * fStack_344 + fVar201 * fStack_364;
    fVar275 = fVar293 * fStack_160 +
              fVar275 * fStack_310 + fVar160 * fStack_340 + fVar205 * fStack_360;
    fVar290 = fVar300 * fStack_15c +
              fVar176 * fStack_30c + fVar162 * fStack_33c + fVar231 * fStack_35c;
    fVar264 = fVar177 * (fVar246 + fVar246);
    fVar160 = fVar199 * (fVar158 + fVar158);
    fVar176 = fVar204 * (fVar274 + fVar274);
    fVar293 = fVar206 * (fVar288 + fVar288);
    fVar265 = (fVar264 - fVar246 * fVar246) * 0.5;
    fVar162 = (fVar160 - fVar158 * fVar158) * 0.5;
    fVar278 = (fVar176 - fVar274 * fVar274) * 0.5;
    fVar300 = (fVar293 - fVar288 * fVar288) * 0.5;
    fVar201 = (fVar177 * fVar232 + (fVar177 + fVar177) * (fVar232 + -5.0)) * 0.5;
    fVar200 = (fVar199 * fVar233 + (fVar199 + fVar199) * (fVar233 + -5.0)) * 0.5;
    fVar205 = (fVar204 * fVar244 + (fVar204 + fVar204) * (fVar244 + -5.0)) * 0.5;
    fVar231 = (fVar206 * fVar245 + (fVar206 + fVar206) * (fVar245 + -5.0)) * 0.5;
    fVar232 = ((fVar232 + 2.0) * (fVar246 + fVar246) - fVar246 * 3.0 * fVar246) * 0.5;
    fVar233 = ((fVar233 + 2.0) * (fVar158 + fVar158) - fVar158 * 3.0 * fVar158) * 0.5;
    fVar244 = ((fVar244 + 2.0) * (fVar274 + fVar274) - fVar274 * 3.0 * fVar274) * 0.5;
    fVar245 = ((fVar245 + 2.0) * (fVar288 + fVar288) - fVar288 * 3.0 * fVar288) * 0.5;
    fVar246 = (fVar177 * fVar177 - fVar264) * 0.5;
    fVar177 = (fVar199 * fVar199 - fVar160) * 0.5;
    fVar199 = (fVar204 * fVar204 - fVar176) * 0.5;
    fVar204 = (fVar206 * fVar206 - fVar293) * 0.5;
    local_4e8 = (local_2c8 * fVar265 +
                local_2e8 * fVar201 + local_328 * fVar232 + local_588 * fVar246) * fVar124;
    fStack_4e4 = (fStack_2c4 * fVar162 +
                 fStack_2e4 * fVar200 + fStack_324 * fVar233 + fStack_584 * fVar177) * fVar124;
    fStack_4e0 = (fStack_2c0 * fVar278 +
                 fStack_2e0 * fVar205 + fStack_320 * fVar244 + fStack_580 * fVar199) * fVar124;
    fStack_4dc = (fStack_2bc * fVar300 +
                 fStack_2dc * fVar231 + fStack_31c * fVar245 + fStack_57c * fVar204) * fVar124;
    local_488 = (local_158 * fVar265 + local_2f8 * fVar201 + local_458 * fVar232 + fVar161 * fVar246
                ) * fVar124;
    fStack_484 = (fStack_154 * fVar162 +
                 fStack_2f4 * fVar200 + fStack_454 * fVar233 + fVar161 * fVar177) * fVar124;
    fStack_480 = (fStack_150 * fVar278 +
                 fStack_2f0 * fVar205 + fStack_450 * fVar244 + fVar161 * fVar199) * fVar124;
    fStack_47c = (fStack_14c * fVar300 +
                 fStack_2ec * fVar231 + fStack_44c * fVar245 + fVar161 * fVar204) * fVar124;
    local_498._0_4_ =
         (local_2d8 * fVar265 + local_308 * fVar201 + local_338 * fVar232 + local_358 * fVar246) *
         fVar124;
    local_498._4_4_ =
         (fStack_2d4 * fVar162 + fStack_304 * fVar200 + fStack_334 * fVar233 + fStack_354 * fVar177)
         * fVar124;
    fStack_490 = (fStack_2d0 * fVar278 +
                 fStack_300 * fVar205 + fStack_330 * fVar244 + fStack_350 * fVar199) * fVar124;
    fStack_48c = (fStack_2cc * fVar300 +
                 fStack_2fc * fVar231 + fStack_32c * fVar245 + fStack_34c * fVar204) * fVar124;
    fVar177 = fVar124 * (fVar162 * fStack_164 +
                        fVar200 * fStack_314 + fVar233 * fStack_344 + fVar177 * fStack_364);
    fVar199 = fVar124 * (fVar278 * fStack_160 +
                        fVar205 * fStack_310 + fVar244 * fStack_340 + fVar199 * fStack_360);
    fVar200 = fVar124 * (fVar300 * fStack_15c +
                        fVar231 * fStack_30c + fVar245 * fStack_33c + fVar204 * fStack_35c);
    local_478._4_4_ = fVar303;
    local_478._0_4_ = fVar302;
    fStack_470 = fVar314;
    fStack_46c = 0.0;
    auVar24._4_4_ = fVar159;
    auVar24._0_4_ = fVar125;
    auVar24._8_4_ = fVar275;
    auVar24._12_4_ = fVar290;
    auVar202._0_12_ = auVar24._4_12_;
    auVar202._12_4_ = 0;
    auVar252._0_4_ =
         fVar125 + fVar124 * (fVar265 * local_168 +
                             fVar201 * local_318 + fVar232 * local_348 + fVar246 * local_368);
    auVar252._4_4_ = fVar159 + fVar177;
    auVar252._8_4_ = fVar275 + fVar199;
    auVar252._12_4_ = fVar290 + fVar200;
    auVar259._0_8_ = CONCAT44(fVar275 - fVar199,fVar159 - fVar177);
    auVar259._8_4_ = fVar290 - fVar200;
    auVar259._12_4_ = 0;
    local_3f8._0_4_ = fVar316 - fVar315;
    local_3f8._4_4_ = fVar317 - fVar316;
    local_3f8._8_4_ = fVar321 - fVar317;
    local_3f8._12_4_ = 0.0 - fVar321;
    local_408._0_4_ = fVar302 - fVar301;
    local_408._4_4_ = fVar303 - fVar302;
    fStack_400 = fVar314 - fVar303;
    fStack_3fc = 0.0 - fVar314;
    fVar124 = local_488 * (float)local_408._0_4_ - (float)local_498._0_4_ * (float)local_3f8._0_4_;
    fVar177 = fStack_484 * (float)local_408._4_4_ - (float)local_498._4_4_ * (float)local_3f8._4_4_;
    fVar199 = fStack_480 * fStack_400 - fStack_490 * (float)local_3f8._8_4_;
    fVar200 = fStack_47c * fStack_3fc - fStack_48c * (float)local_3f8._12_4_;
    local_418 = fVar257 - fVar256;
    fStack_414 = fVar258 - fVar257;
    fStack_410 = fVar263 - fVar258;
    fStack_40c = 0.0 - fVar263;
    fVar231 = (float)local_498._0_4_ * local_418 - local_4e8 * (float)local_408._0_4_;
    fVar232 = (float)local_498._4_4_ * fStack_414 - fStack_4e4 * (float)local_408._4_4_;
    fVar233 = fStack_490 * fStack_410 - fStack_4e0 * fStack_400;
    fVar244 = fStack_48c * fStack_40c - fStack_4dc * fStack_3fc;
    fVar245 = local_4e8 * (float)local_3f8._0_4_ - local_488 * local_418;
    fVar246 = fStack_4e4 * (float)local_3f8._4_4_ - fStack_484 * fStack_414;
    fVar264 = fStack_4e0 * (float)local_3f8._8_4_ - fStack_480 * fStack_410;
    fVar265 = fStack_4dc * (float)local_3f8._12_4_ - fStack_47c * fStack_40c;
    auVar139._0_4_ = (float)local_408._0_4_ * (float)local_408._0_4_;
    auVar139._4_4_ = (float)local_408._4_4_ * (float)local_408._4_4_;
    auVar139._8_4_ = fStack_400 * fStack_400;
    auVar139._12_4_ = fStack_3fc * fStack_3fc;
    auVar183._0_4_ =
         local_418 * local_418 + (float)local_3f8._0_4_ * (float)local_3f8._0_4_ + auVar139._0_4_;
    auVar183._4_4_ =
         fStack_414 * fStack_414 + (float)local_3f8._4_4_ * (float)local_3f8._4_4_ + auVar139._4_4_;
    auVar183._8_4_ =
         fStack_410 * fStack_410 + (float)local_3f8._8_4_ * (float)local_3f8._8_4_ + auVar139._8_4_;
    auVar183._12_4_ =
         fStack_40c * fStack_40c +
         (float)local_3f8._12_4_ * (float)local_3f8._12_4_ + auVar139._12_4_;
    auVar84 = rcpps(auVar139,auVar183);
    fVar201 = auVar84._0_4_;
    fVar204 = auVar84._4_4_;
    fVar205 = auVar84._8_4_;
    fVar206 = auVar84._12_4_;
    fVar201 = (1.0 - fVar201 * auVar183._0_4_) * fVar201 + fVar201;
    fVar204 = (1.0 - fVar204 * auVar183._4_4_) * fVar204 + fVar204;
    fVar205 = (1.0 - fVar205 * auVar183._8_4_) * fVar205 + fVar205;
    fVar206 = (1.0 - fVar206 * auVar183._12_4_) * fVar206 + fVar206;
    fVar158 = (float)local_408._0_4_ * fStack_484 - (float)local_3f8._0_4_ * (float)local_498._4_4_;
    fVar160 = (float)local_408._4_4_ * fStack_480 - (float)local_3f8._4_4_ * fStack_490;
    fVar162 = fStack_400 * fStack_47c - (float)local_3f8._8_4_ * fStack_48c;
    fVar274 = fStack_3fc * 0.0 - (float)local_3f8._12_4_ * 0.0;
    local_4b8 = (float)local_498._4_4_;
    fStack_4b4 = fStack_490;
    fStack_4b0 = fStack_48c;
    fStack_4ac = 0.0;
    auVar25._4_4_ = fVar159;
    auVar25._0_4_ = fVar125;
    auVar25._8_4_ = fVar275;
    auVar25._12_4_ = fVar290;
    fVar125 = local_418 * (float)local_498._4_4_ - (float)local_408._0_4_ * fStack_4e4;
    fVar159 = fStack_414 * fStack_490 - (float)local_408._4_4_ * fStack_4e0;
    fVar275 = fStack_410 * fStack_48c - fStack_400 * fStack_4dc;
    fVar176 = fStack_40c * 0.0 - fStack_3fc * 0.0;
    local_4a8 = fStack_484;
    fStack_4a4 = fStack_480;
    fStack_4a0 = fStack_47c;
    fStack_49c = 0.0;
    local_4d8._4_4_ = fStack_4e0;
    local_4d8._0_4_ = fStack_4e4;
    fStack_4d0 = fStack_4dc;
    uStack_4cc = 0;
    fVar278 = (float)local_3f8._0_4_ * fStack_4e4 - local_418 * fStack_484;
    fVar288 = (float)local_3f8._4_4_ * fStack_4e0 - fStack_414 * fStack_480;
    fVar290 = (float)local_3f8._8_4_ * fStack_4dc - fStack_410 * fStack_47c;
    fVar293 = (float)local_3f8._12_4_ * 0.0 - fStack_40c * 0.0;
    auVar103._0_4_ = (fVar124 * fVar124 + fVar231 * fVar231 + fVar245 * fVar245) * fVar201;
    auVar103._4_4_ = (fVar177 * fVar177 + fVar232 * fVar232 + fVar246 * fVar246) * fVar204;
    auVar103._8_4_ = (fVar199 * fVar199 + fVar233 * fVar233 + fVar264 * fVar264) * fVar205;
    auVar103._12_4_ = (fVar200 * fVar200 + fVar244 * fVar244 + fVar265 * fVar265) * fVar206;
    auVar271._0_4_ = (fVar158 * fVar158 + fVar125 * fVar125 + fVar278 * fVar278) * fVar201;
    auVar271._4_4_ = (fVar160 * fVar160 + fVar159 * fVar159 + fVar288 * fVar288) * fVar204;
    auVar271._8_4_ = (fVar162 * fVar162 + fVar275 * fVar275 + fVar290 * fVar290) * fVar205;
    auVar271._12_4_ = (fVar274 * fVar274 + fVar176 * fVar176 + fVar293 * fVar293) * fVar206;
    auVar84 = maxps(auVar103,auVar271);
    auVar164 = maxps(auVar25,auVar252);
    auVar272._8_4_ = auVar259._8_4_;
    auVar272._0_8_ = auVar259._0_8_;
    auVar272._12_4_ = 0;
    auVar270 = maxps(auVar272,auVar202);
    auVar236 = maxps(auVar164,auVar270);
    auVar164 = minps(auVar25,auVar252);
    auVar270 = minps(auVar259,auVar202);
    auVar270 = minps(auVar164,auVar270);
    auVar84 = sqrtps(auVar84,auVar84);
    auVar164 = rsqrtps(auVar84,auVar183);
    fVar124 = auVar164._0_4_;
    fVar177 = auVar164._4_4_;
    fVar199 = auVar164._8_4_;
    fVar200 = auVar164._12_4_;
    fVar245 = fVar124 * 1.5 - fVar124 * fVar124 * auVar183._0_4_ * 0.5 * fVar124;
    fVar246 = fVar177 * 1.5 - fVar177 * fVar177 * auVar183._4_4_ * 0.5 * fVar177;
    fVar264 = fVar199 * 1.5 - fVar199 * fVar199 * auVar183._8_4_ * 0.5 * fVar199;
    fVar265 = fVar200 * 1.5 - fVar200 * fVar200 * auVar183._12_4_ * 0.5 * fVar200;
    local_4c8 = 0.0 - fVar315;
    fStack_4c4 = 0.0 - fVar316;
    fStack_4c0 = 0.0 - fVar317;
    fStack_4bc = 0.0 - fVar321;
    fVar162 = 0.0 - fVar301;
    fVar274 = 0.0 - fVar302;
    fVar275 = 0.0 - fVar303;
    fVar176 = 0.0 - fVar314;
    fVar124 = 0.0 - fVar256;
    fVar177 = 0.0 - fVar257;
    fVar199 = 0.0 - fVar258;
    fVar200 = 0.0 - fVar263;
    fVar201 = local_578 * local_418 * fVar245 +
              local_568 * (float)local_3f8._0_4_ * fVar245 +
              fVar121 * (float)local_408._0_4_ * fVar245;
    fVar204 = fStack_574 * fStack_414 * fVar246 +
              fStack_564 * (float)local_3f8._4_4_ * fVar246 +
              fVar121 * (float)local_408._4_4_ * fVar246;
    fVar205 = fStack_570 * fStack_410 * fVar264 +
              fStack_560 * (float)local_3f8._8_4_ * fVar264 + fVar121 * fStack_400 * fVar264;
    fVar206 = fStack_56c * fStack_40c * fVar265 +
              fStack_55c * (float)local_3f8._12_4_ * fVar265 + fVar121 * fStack_3fc * fVar265;
    local_558 = local_418 * fVar245 * fVar124 +
                (float)local_3f8._0_4_ * fVar245 * local_4c8 +
                (float)local_408._0_4_ * fVar245 * fVar162;
    fStack_554 = fStack_414 * fVar246 * fVar177 +
                 (float)local_3f8._4_4_ * fVar246 * fStack_4c4 +
                 (float)local_408._4_4_ * fVar246 * fVar274;
    fStack_550 = fStack_410 * fVar264 * fVar199 +
                 (float)local_3f8._8_4_ * fVar264 * fStack_4c0 + fStack_400 * fVar264 * fVar275;
    fStack_54c = fStack_40c * fVar265 * fVar200 +
                 (float)local_3f8._12_4_ * fVar265 * fStack_4bc + fStack_3fc * fVar265 * fVar176;
    local_188 = (local_578 * fVar124 + local_568 * local_4c8 + fVar121 * fVar162) -
                fVar201 * local_558;
    fStack_184 = (fStack_574 * fVar177 + fStack_564 * fStack_4c4 + fVar121 * fVar274) -
                 fVar204 * fStack_554;
    fStack_180 = (fStack_570 * fVar199 + fStack_560 * fStack_4c0 + fVar121 * fVar275) -
                 fVar205 * fStack_550;
    fStack_17c = (fStack_56c * fVar200 + fStack_55c * fStack_4bc + fVar121 * fVar176) -
                 fVar206 * fStack_54c;
    fVar125 = (fVar124 * fVar124 + local_4c8 * local_4c8 + fVar162 * fVar162) -
              local_558 * local_558;
    fVar158 = (fVar177 * fVar177 + fStack_4c4 * fStack_4c4 + fVar274 * fVar274) -
              fStack_554 * fStack_554;
    fVar159 = (fVar199 * fVar199 + fStack_4c0 * fStack_4c0 + fVar275 * fVar275) -
              fStack_550 * fStack_550;
    fVar160 = (fVar200 * fVar200 + fStack_4bc * fStack_4bc + fVar176 * fVar176) -
              fStack_54c * fStack_54c;
    fVar231 = (auVar236._0_4_ + auVar84._0_4_) * 1.0000002;
    fVar232 = (auVar236._4_4_ + auVar84._4_4_) * 1.0000002;
    fVar233 = (auVar236._8_4_ + auVar84._8_4_) * 1.0000002;
    fVar244 = (auVar236._12_4_ + auVar84._12_4_) * 1.0000002;
    auVar260._0_4_ = fVar125 - fVar231 * fVar231;
    auVar260._4_4_ = fVar158 - fVar232 * fVar232;
    auVar260._8_4_ = fVar159 - fVar233 * fVar233;
    auVar260._12_4_ = fVar160 - fVar244 * fVar244;
    local_178 = fVar201 * fVar201;
    fStack_174 = fVar204 * fVar204;
    fStack_170 = fVar205 * fVar205;
    fStack_16c = fVar206 * fVar206;
    fVar278 = local_148 - local_178;
    fVar288 = fStack_144 - fStack_174;
    fVar290 = fStack_140 - fStack_170;
    fVar293 = fStack_13c - fStack_16c;
    local_188 = local_188 + local_188;
    fStack_184 = fStack_184 + fStack_184;
    fStack_180 = fStack_180 + fStack_180;
    fStack_17c = fStack_17c + fStack_17c;
    local_508._0_4_ = local_188 * local_188;
    local_508._4_4_ = fStack_184 * fStack_184;
    fStack_500 = fStack_180 * fStack_180;
    fStack_4fc = fStack_17c * fStack_17c;
    fVar231 = fVar278 * 4.0;
    fVar232 = fVar288 * 4.0;
    fVar233 = fVar290 * 4.0;
    fVar244 = fVar293 * 4.0;
    auVar309._0_4_ = (float)local_508._0_4_ - fVar231 * auVar260._0_4_;
    auVar309._4_4_ = (float)local_508._4_4_ - fVar232 * auVar260._4_4_;
    auVar309._8_4_ = fStack_500 - fVar233 * auVar260._8_4_;
    auVar309._12_4_ = fStack_4fc - fVar244 * auVar260._12_4_;
    auVar184._4_4_ = -(uint)(0.0 <= auVar309._4_4_);
    auVar184._0_4_ = -(uint)(0.0 <= auVar309._0_4_);
    auVar184._8_4_ = -(uint)(0.0 <= auVar309._8_4_);
    auVar184._12_4_ = -(uint)(0.0 <= auVar309._12_4_);
    uVar68 = (undefined4)((ulong)lVar67 >> 0x20);
    iVar60 = movmskps((int)lVar67,auVar184);
    if (iVar60 == 0) {
      iVar60 = 0;
      auVar261 = _DAT_01f7a9f0;
      auVar285 = _DAT_01f7aa00;
    }
    else {
      auVar236 = sqrtps(local_3f8,auVar309);
      bVar76 = 0.0 <= auVar309._0_4_;
      uVar77 = -(uint)bVar76;
      bVar21 = 0.0 <= auVar309._4_4_;
      uVar78 = -(uint)bVar21;
      bVar22 = 0.0 <= auVar309._8_4_;
      uVar79 = -(uint)bVar22;
      bVar23 = 0.0 <= auVar309._12_4_;
      uVar80 = -(uint)bVar23;
      auVar237._0_4_ = fVar278 + fVar278;
      auVar237._4_4_ = fVar288 + fVar288;
      auVar237._8_4_ = fVar290 + fVar290;
      auVar237._12_4_ = fVar293 + fVar293;
      auVar164 = rcpps(auVar260,auVar237);
      fVar300 = auVar164._0_4_;
      fVar322 = auVar164._4_4_;
      fVar276 = auVar164._8_4_;
      fVar277 = auVar164._12_4_;
      fVar300 = (1.0 - auVar237._0_4_ * fVar300) * fVar300 + fVar300;
      fVar322 = (1.0 - auVar237._4_4_ * fVar322) * fVar322 + fVar322;
      fVar276 = (1.0 - auVar237._8_4_ * fVar276) * fVar276 + fVar276;
      fVar277 = (1.0 - auVar237._12_4_ * fVar277) * fVar277 + fVar277;
      fVar279 = (-local_188 - auVar236._0_4_) * fVar300;
      fVar289 = (-fStack_184 - auVar236._4_4_) * fVar322;
      fVar291 = (-fStack_180 - auVar236._8_4_) * fVar276;
      fVar292 = (-fStack_17c - auVar236._12_4_) * fVar277;
      fVar300 = (auVar236._0_4_ - local_188) * fVar300;
      fVar322 = (auVar236._4_4_ - fStack_184) * fVar322;
      fVar276 = (auVar236._8_4_ - fStack_180) * fVar276;
      fVar277 = (auVar236._12_4_ - fStack_17c) * fVar277;
      local_1e8 = (fVar201 * fVar279 + local_558) * fVar245;
      fStack_1e4 = (fVar204 * fVar289 + fStack_554) * fVar246;
      fStack_1e0 = (fVar205 * fVar291 + fStack_550) * fVar264;
      fStack_1dc = (fVar206 * fVar292 + fStack_54c) * fVar265;
      local_1d8 = (fVar201 * fVar300 + local_558) * fVar245;
      fStack_1d4 = (fVar204 * fVar322 + fStack_554) * fVar246;
      fStack_1d0 = (fVar205 * fVar276 + fStack_550) * fVar264;
      fStack_1cc = (fVar206 * fVar277 + fStack_54c) * fVar265;
      auVar284._0_4_ = (uint)fVar279 & uVar77;
      auVar284._4_4_ = (uint)fVar289 & uVar78;
      auVar284._8_4_ = (uint)fVar291 & uVar79;
      auVar284._12_4_ = (uint)fVar292 & uVar80;
      auVar261._0_8_ = CONCAT44(~uVar78,~uVar77) & 0x7f8000007f800000;
      auVar261._8_4_ = ~uVar79 & 0x7f800000;
      auVar261._12_4_ = ~uVar80 & 0x7f800000;
      auVar261 = auVar261 | auVar284;
      auVar318._0_4_ = (uint)fVar300 & uVar77;
      auVar318._4_4_ = (uint)fVar322 & uVar78;
      auVar318._8_4_ = (uint)fVar276 & uVar79;
      auVar318._12_4_ = (uint)fVar277 & uVar80;
      auVar285._0_8_ = CONCAT44(~uVar78,~uVar77) & 0xff800000ff800000;
      auVar285._8_4_ = ~uVar79 & 0xff800000;
      auVar285._12_4_ = ~uVar80 & 0xff800000;
      auVar285 = auVar285 | auVar318;
      auVar299._0_8_ = CONCAT44(fStack_174,local_178) & 0x7fffffff7fffffff;
      auVar299._8_4_ = ABS(fStack_170);
      auVar299._12_4_ = ABS(fStack_16c);
      auVar33._4_4_ = fStack_374;
      auVar33._0_4_ = local_378;
      auVar33._8_4_ = fStack_370;
      auVar33._12_4_ = fStack_36c;
      auVar164 = maxps(auVar33,auVar299);
      fVar300 = auVar164._0_4_ * 1.9073486e-06;
      fVar322 = auVar164._4_4_ * 1.9073486e-06;
      fVar276 = auVar164._8_4_ * 1.9073486e-06;
      fVar277 = auVar164._12_4_ * 1.9073486e-06;
      auVar319._0_4_ = -(uint)(ABS(fVar278) < fVar300 && bVar76);
      auVar319._4_4_ = -(uint)(ABS(fVar288) < fVar322 && bVar21);
      auVar319._8_4_ = -(uint)(ABS(fVar290) < fVar276 && bVar22);
      auVar319._12_4_ = -(uint)(ABS(fVar293) < fVar277 && bVar23);
      iVar60 = movmskps(iVar60,auVar319);
      if (iVar60 != 0) {
        uVar77 = -(uint)(auVar260._0_4_ <= 0.0);
        uVar78 = -(uint)(auVar260._4_4_ <= 0.0);
        uVar79 = -(uint)(auVar260._8_4_ <= 0.0);
        uVar80 = -(uint)(auVar260._12_4_ <= 0.0);
        auVar273._0_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar319._0_4_;
        auVar273._4_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar319._4_4_;
        auVar273._8_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar319._8_4_;
        auVar273._12_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar319._12_4_;
        auVar165._0_4_ = ~auVar319._0_4_ & auVar261._0_4_;
        auVar165._4_4_ = ~auVar319._4_4_ & auVar261._4_4_;
        auVar165._8_4_ = ~auVar319._8_4_ & auVar261._8_4_;
        auVar165._12_4_ = ~auVar319._12_4_ & auVar261._12_4_;
        auVar262._0_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar319._0_4_;
        auVar262._4_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar319._4_4_;
        auVar262._8_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar319._8_4_;
        auVar262._12_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar319._12_4_;
        auVar320._0_4_ = ~auVar319._0_4_ & auVar285._0_4_;
        auVar320._4_4_ = ~auVar319._4_4_ & auVar285._4_4_;
        auVar320._8_4_ = ~auVar319._8_4_ & auVar285._8_4_;
        auVar320._12_4_ = ~auVar319._12_4_ & auVar285._12_4_;
        auVar184._4_4_ = -(uint)((fVar322 <= ABS(fVar288) || auVar260._4_4_ <= 0.0) && bVar21);
        auVar184._0_4_ = -(uint)((fVar300 <= ABS(fVar278) || auVar260._0_4_ <= 0.0) && bVar76);
        auVar184._8_4_ = -(uint)((fVar276 <= ABS(fVar290) || auVar260._8_4_ <= 0.0) && bVar22);
        auVar184._12_4_ = -(uint)((fVar277 <= ABS(fVar293) || auVar260._12_4_ <= 0.0) && bVar23);
        auVar261 = auVar165 | auVar273;
        auVar285 = auVar320 | auVar262;
      }
    }
    auVar185._0_4_ = (auVar184._0_4_ << 0x1f) >> 0x1f;
    auVar185._4_4_ = (auVar184._4_4_ << 0x1f) >> 0x1f;
    auVar185._8_4_ = (auVar184._8_4_ << 0x1f) >> 0x1f;
    auVar185._12_4_ = (auVar184._12_4_ << 0x1f) >> 0x1f;
    auVar185 = auVar185 & local_1b8;
    iVar60 = movmskps(iVar60,auVar185);
    if (iVar60 != 0) {
      local_1c8 = fVar231;
      fStack_1c4 = fVar232;
      fStack_1c0 = fVar233;
      fStack_1bc = fVar244;
      local_1f8 = fVar201;
      fStack_1f4 = fVar204;
      fStack_1f0 = fVar205;
      fStack_1ec = fVar206;
      local_388 = fVar278;
      fStack_384 = fVar288;
      fStack_380 = fVar290;
      fStack_37c = fVar293;
      fVar300 = *(float *)(ray + k * 4 + 0x80);
      auVar238._0_4_ = fVar300 - (float)local_3e8._0_4_;
      auVar238._4_4_ = auVar238._0_4_;
      auVar238._8_4_ = auVar238._0_4_;
      auVar238._12_4_ = auVar238._0_4_;
      auVar239 = minps(auVar238,auVar285);
      auVar37._4_4_ = fStack_1a4;
      auVar37._0_4_ = local_1a8;
      auVar37._8_4_ = fStack_1a0;
      auVar37._12_4_ = fStack_19c;
      auVar236 = maxps(auVar37,auVar261);
      auVar166._0_4_ = local_488 * local_568 + (float)local_498._0_4_ * fVar121;
      auVar166._4_4_ = fStack_484 * fStack_564 + (float)local_498._4_4_ * fVar121;
      auVar166._8_4_ = fStack_480 * fStack_560 + fStack_490 * fVar121;
      auVar166._12_4_ = fStack_47c * fStack_55c + fStack_48c * fVar121;
      auVar323._0_4_ = local_4e8 * local_578 + auVar166._0_4_;
      auVar323._4_4_ = fStack_4e4 * fStack_574 + auVar166._4_4_;
      auVar323._8_4_ = fStack_4e0 * fStack_570 + auVar166._8_4_;
      auVar323._12_4_ = fStack_4dc * fStack_56c + auVar166._12_4_;
      auVar164 = rcpps(auVar166,auVar323);
      fVar322 = auVar164._0_4_;
      fVar276 = auVar164._4_4_;
      fVar277 = auVar164._8_4_;
      fVar279 = auVar164._12_4_;
      fVar124 = ((1.0 - auVar323._0_4_ * fVar322) * fVar322 + fVar322) *
                -(fVar124 * local_4e8 + local_4c8 * local_488 + fVar162 * (float)local_498._0_4_);
      fVar177 = ((1.0 - auVar323._4_4_ * fVar276) * fVar276 + fVar276) *
                -(fVar177 * fStack_4e4 + fStack_4c4 * fStack_484 + fVar274 * (float)local_498._4_4_)
      ;
      fVar199 = ((1.0 - auVar323._8_4_ * fVar277) * fVar277 + fVar277) *
                -(fVar199 * fStack_4e0 + fStack_4c0 * fStack_480 + fVar275 * fStack_490);
      fVar200 = ((1.0 - auVar323._12_4_ * fVar279) * fVar279 + fVar279) *
                -(fVar200 * fStack_4dc + fStack_4bc * fStack_47c + fVar176 * fStack_48c);
      uVar77 = -(uint)(auVar323._0_4_ < 0.0 || ABS(auVar323._0_4_) < 1e-18);
      uVar78 = -(uint)(auVar323._4_4_ < 0.0 || ABS(auVar323._4_4_) < 1e-18);
      uVar79 = -(uint)(auVar323._8_4_ < 0.0 || ABS(auVar323._8_4_) < 1e-18);
      uVar80 = -(uint)(auVar323._12_4_ < 0.0 || ABS(auVar323._12_4_) < 1e-18);
      auVar167._0_8_ = CONCAT44(uVar78,uVar77) & 0xff800000ff800000;
      auVar167._8_4_ = uVar79 & 0xff800000;
      auVar167._12_4_ = uVar80 & 0xff800000;
      auVar104._0_4_ = ~uVar77 & (uint)fVar124;
      auVar104._4_4_ = ~uVar78 & (uint)fVar177;
      auVar104._8_4_ = ~uVar79 & (uint)fVar199;
      auVar104._12_4_ = ~uVar80 & (uint)fVar200;
      auVar236 = maxps(auVar236,auVar104 | auVar167);
      uVar77 = -(uint)(0.0 < auVar323._0_4_ || ABS(auVar323._0_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar323._4_4_ || ABS(auVar323._4_4_) < 1e-18);
      uVar79 = -(uint)(0.0 < auVar323._8_4_ || ABS(auVar323._8_4_) < 1e-18);
      uVar80 = -(uint)(0.0 < auVar323._12_4_ || ABS(auVar323._12_4_) < 1e-18);
      auVar105._0_8_ = CONCAT44(uVar78,uVar77) & 0x7f8000007f800000;
      auVar105._8_4_ = uVar79 & 0x7f800000;
      auVar105._12_4_ = uVar80 & 0x7f800000;
      auVar324._0_4_ = ~uVar77 & (uint)fVar124;
      auVar324._4_4_ = ~uVar78 & (uint)fVar177;
      auVar324._8_4_ = ~uVar79 & (uint)fVar199;
      auVar324._12_4_ = ~uVar80 & (uint)fVar200;
      auVar239 = minps(auVar239,auVar324 | auVar105);
      auVar168._0_4_ = (0.0 - fVar316) * -fStack_484 + (0.0 - fVar302) * -(float)local_498._4_4_;
      auVar168._4_4_ = (0.0 - fVar317) * -fStack_480 + (0.0 - fVar303) * -fStack_490;
      auVar168._8_4_ = (0.0 - fVar321) * -fStack_47c + (0.0 - fVar314) * -fStack_48c;
      auVar168._12_4_ = 0x80000000;
      auVar140._0_4_ =
           -fStack_4e4 * local_578 + -fStack_484 * local_568 + -(float)local_498._4_4_ * fVar121;
      auVar140._4_4_ = -fStack_4e0 * fStack_574 + -fStack_480 * fStack_564 + -fStack_490 * fVar121;
      auVar140._8_4_ = -fStack_4dc * fStack_570 + -fStack_47c * fStack_560 + -fStack_48c * fVar121;
      auVar140._12_4_ = fStack_56c * -0.0 + fStack_55c * -0.0 + fVar121 * -0.0;
      auVar164 = rcpps(auVar168,auVar140);
      fVar124 = auVar164._0_4_;
      fVar177 = auVar164._4_4_;
      fVar199 = auVar164._8_4_;
      fVar200 = auVar164._12_4_;
      fVar124 = (((float)DAT_01f7ba10 - auVar140._0_4_ * fVar124) * fVar124 + fVar124) *
                -((0.0 - fVar257) * -fStack_4e4 + auVar168._0_4_);
      fVar177 = ((DAT_01f7ba10._4_4_ - auVar140._4_4_ * fVar177) * fVar177 + fVar177) *
                -((0.0 - fVar258) * -fStack_4e0 + auVar168._4_4_);
      fVar199 = ((DAT_01f7ba10._8_4_ - auVar140._8_4_ * fVar199) * fVar199 + fVar199) *
                -((0.0 - fVar263) * -fStack_4dc + auVar168._8_4_);
      fVar200 = ((DAT_01f7ba10._12_4_ - auVar140._12_4_ * fVar200) * fVar200 + fVar200) * 0.0;
      uVar77 = -(uint)(auVar140._0_4_ < 0.0 || ABS(auVar140._0_4_) < 1e-18);
      uVar78 = -(uint)(auVar140._4_4_ < 0.0 || ABS(auVar140._4_4_) < 1e-18);
      uVar79 = -(uint)(auVar140._8_4_ < 0.0 || ABS(auVar140._8_4_) < 1e-18);
      uVar80 = -(uint)(auVar140._12_4_ < 0.0 || ABS(auVar140._12_4_) < 1e-18);
      auVar310._0_8_ = CONCAT44(uVar78,uVar77) & 0xff800000ff800000;
      auVar310._8_4_ = uVar79 & 0xff800000;
      auVar310._12_4_ = uVar80 & 0xff800000;
      auVar106._0_4_ = ~uVar77 & (uint)fVar124;
      auVar106._4_4_ = ~uVar78 & (uint)fVar177;
      auVar106._8_4_ = ~uVar79 & (uint)fVar199;
      auVar106._12_4_ = ~uVar80 & (uint)fVar200;
      auVar164 = maxps(auVar236,auVar106 | auVar310);
      uVar77 = -(uint)(0.0 < auVar140._0_4_ || ABS(auVar140._0_4_) < 1e-18);
      uVar78 = -(uint)(0.0 < auVar140._4_4_ || ABS(auVar140._4_4_) < 1e-18);
      uVar79 = -(uint)(0.0 < auVar140._8_4_ || ABS(auVar140._8_4_) < 1e-18);
      uVar80 = -(uint)(0.0 < auVar140._12_4_ || ABS(auVar140._12_4_) < 1e-18);
      auVar107._0_8_ = CONCAT44(uVar78,uVar77) & 0x7f8000007f800000;
      auVar107._8_4_ = uVar79 & 0x7f800000;
      auVar107._12_4_ = uVar80 & 0x7f800000;
      auVar141._0_4_ = ~uVar77 & (uint)fVar124;
      auVar141._4_4_ = ~uVar78 & (uint)fVar177;
      auVar141._8_4_ = ~uVar79 & (uint)fVar199;
      auVar141._12_4_ = ~uVar80 & (uint)fVar200;
      auVar236 = minps(auVar239,auVar141 | auVar107);
      fVar200 = auVar164._12_4_;
      fVar124 = auVar164._0_4_;
      fVar177 = auVar164._4_4_;
      fVar199 = auVar164._8_4_;
      auVar142._0_4_ = -(uint)(fVar124 <= auVar236._0_4_) & auVar185._0_4_;
      auVar142._4_4_ = -(uint)(fVar177 <= auVar236._4_4_) & auVar185._4_4_;
      auVar142._8_4_ = -(uint)(fVar199 <= auVar236._8_4_) & auVar185._8_4_;
      auVar142._12_4_ = -(uint)(fVar200 <= auVar236._12_4_) & auVar185._12_4_;
      iVar60 = movmskps(iVar60,auVar142);
      if (iVar60 != 0) {
        auVar26._4_4_ = (auVar270._4_4_ - auVar84._4_4_) * 0.99999976;
        auVar26._0_4_ = (auVar270._0_4_ - auVar84._0_4_) * 0.99999976;
        auVar26._8_4_ = (auVar270._8_4_ - auVar84._8_4_) * 0.99999976;
        auVar26._12_4_ = (auVar270._12_4_ - auVar84._12_4_) * 0.99999976;
        auVar84 = maxps(ZEXT816(0),auVar26);
        auVar35._4_4_ = fStack_1e4;
        auVar35._0_4_ = local_1e8;
        auVar35._8_4_ = fStack_1e0;
        auVar35._12_4_ = fStack_1dc;
        auVar270 = minps(auVar35,_DAT_01f7ba10);
        auVar203._0_12_ = ZEXT812(0);
        auVar203._12_4_ = 0.0;
        auVar239 = maxps(auVar270,auVar203);
        auVar36._4_4_ = fStack_1d4;
        auVar36._0_4_ = local_1d8;
        auVar36._8_4_ = fStack_1d0;
        auVar36._12_4_ = fStack_1cc;
        auVar270 = minps(auVar36,_DAT_01f7ba10);
        auVar270 = maxps(auVar270,auVar203);
        local_108[0] = (auVar239._0_4_ + 0.0) * 0.25 * (float)local_4f8._4_4_ + local_198;
        local_108[1] = (auVar239._4_4_ + 1.0) * 0.25 * (float)local_4f8._4_4_ + local_198;
        local_108[2] = (auVar239._8_4_ + 2.0) * 0.25 * (float)local_4f8._4_4_ + local_198;
        local_108[3] = (auVar239._12_4_ + 3.0) * 0.25 * (float)local_4f8._4_4_ + local_198;
        local_118[0] = (auVar270._0_4_ + 0.0) * 0.25 * (float)local_4f8._4_4_ + local_198;
        local_118[1] = (auVar270._4_4_ + 1.0) * 0.25 * (float)local_4f8._4_4_ + local_198;
        local_118[2] = (auVar270._8_4_ + 2.0) * 0.25 * (float)local_4f8._4_4_ + local_198;
        local_118[3] = (auVar270._12_4_ + 3.0) * 0.25 * (float)local_4f8._4_4_ + local_198;
        auVar169._0_4_ = fVar125 - auVar84._0_4_ * auVar84._0_4_;
        auVar169._4_4_ = fVar158 - auVar84._4_4_ * auVar84._4_4_;
        auVar169._8_4_ = fVar159 - auVar84._8_4_ * auVar84._8_4_;
        auVar169._12_4_ = fVar160 - auVar84._12_4_ * auVar84._12_4_;
        auVar311._0_4_ = (float)local_508._0_4_ - fVar231 * auVar169._0_4_;
        auVar311._4_4_ = (float)local_508._4_4_ - fVar232 * auVar169._4_4_;
        auVar311._8_4_ = fStack_500 - fVar233 * auVar169._8_4_;
        auVar311._12_4_ = fStack_4fc - fVar244 * auVar169._12_4_;
        local_508._4_4_ = -(uint)(0.0 <= auVar311._4_4_);
        local_508._0_4_ = -(uint)(0.0 <= auVar311._0_4_);
        fStack_500 = (float)-(uint)(0.0 <= auVar311._8_4_);
        fStack_4fc = (float)-(uint)(0.0 <= auVar311._12_4_);
        iVar60 = movmskps(iVar60,_local_508);
        if (iVar60 == 0) {
          fVar201 = 0.0;
          fVar204 = 0.0;
          fVar205 = 0.0;
          fVar206 = 0.0;
          fVar256 = 0.0;
          fVar257 = 0.0;
          fVar258 = 0.0;
          fVar263 = 0.0;
          fVar231 = 0.0;
          fVar232 = 0.0;
          fVar233 = 0.0;
          fVar244 = 0.0;
          local_698 = 0.0;
          fStack_694 = 0.0;
          fStack_690 = 0.0;
          fStack_68c = 0.0;
          _local_598 = ZEXT816(0);
          iVar60 = 0;
          auVar241 = _DAT_01f7aa00;
          auVar253 = _DAT_01f7a9f0;
        }
        else {
          auVar270 = sqrtps(_local_4f8,auVar311);
          auVar108._0_4_ = fVar278 + fVar278;
          auVar108._4_4_ = fVar288 + fVar288;
          auVar108._8_4_ = fVar290 + fVar290;
          auVar108._12_4_ = fVar293 + fVar293;
          auVar84 = rcpps(auVar169,auVar108);
          fVar125 = auVar84._0_4_;
          fVar158 = auVar84._4_4_;
          fVar159 = auVar84._8_4_;
          fVar160 = auVar84._12_4_;
          fVar125 = ((float)DAT_01f7ba10 - auVar108._0_4_ * fVar125) * fVar125 + fVar125;
          fVar158 = (DAT_01f7ba10._4_4_ - auVar108._4_4_ * fVar158) * fVar158 + fVar158;
          fVar159 = (DAT_01f7ba10._8_4_ - auVar108._8_4_ * fVar159) * fVar159 + fVar159;
          fVar160 = (DAT_01f7ba10._12_4_ - auVar108._12_4_ * fVar160) * fVar160 + fVar160;
          fVar322 = (-local_188 - auVar270._0_4_) * fVar125;
          fVar276 = (-fStack_184 - auVar270._4_4_) * fVar158;
          fVar277 = (-fStack_180 - auVar270._8_4_) * fVar159;
          fVar279 = (-fStack_17c - auVar270._12_4_) * fVar160;
          fVar125 = (auVar270._0_4_ - local_188) * fVar125;
          fVar158 = (auVar270._4_4_ - fStack_184) * fVar158;
          fVar159 = (auVar270._8_4_ - fStack_180) * fVar159;
          fVar160 = (auVar270._12_4_ - fStack_17c) * fVar160;
          fVar162 = (fVar201 * fVar322 + local_558) * fVar245;
          fVar274 = (fVar204 * fVar276 + fStack_554) * fVar246;
          fVar275 = (fVar205 * fVar277 + fStack_550) * fVar264;
          fVar176 = (fVar206 * fVar279 + fStack_54c) * fVar265;
          fVar231 = local_578 * fVar322 - (local_418 * fVar162 + fVar256);
          fVar232 = fStack_574 * fVar276 - (fStack_414 * fVar274 + fVar257);
          fVar233 = fStack_570 * fVar277 - (fStack_410 * fVar275 + fVar258);
          fVar244 = fStack_56c * fVar279 - (fStack_40c * fVar176 + fVar263);
          local_698 = local_568 * fVar322 - ((float)local_3f8._0_4_ * fVar162 + fVar315);
          fStack_694 = fStack_564 * fVar276 - ((float)local_3f8._4_4_ * fVar274 + fVar316);
          fStack_690 = fStack_560 * fVar277 - ((float)local_3f8._8_4_ * fVar275 + fVar317);
          fStack_68c = fStack_55c * fVar279 - ((float)local_3f8._12_4_ * fVar176 + fVar321);
          local_598._4_4_ = fVar121 * fVar276 - (fVar274 * (float)local_408._4_4_ + fVar302);
          local_598._0_4_ = fVar121 * fVar322 - (fVar162 * (float)local_408._0_4_ + fVar301);
          fStack_590 = fVar121 * fVar277 - (fVar275 * fStack_400 + fVar303);
          fStack_58c = fVar121 * fVar279 - (fVar176 * fStack_3fc + fVar314);
          fVar245 = (fVar201 * fVar125 + local_558) * fVar245;
          fVar246 = (fVar204 * fVar158 + fStack_554) * fVar246;
          fVar264 = (fVar205 * fVar159 + fStack_550) * fVar264;
          fVar265 = (fVar206 * fVar160 + fStack_54c) * fVar265;
          fVar201 = local_578 * fVar125 - (local_418 * fVar245 + fVar256);
          fVar204 = fStack_574 * fVar158 - (fStack_414 * fVar246 + fVar257);
          fVar205 = fStack_570 * fVar159 - (fStack_410 * fVar264 + fVar258);
          fVar206 = fStack_56c * fVar160 - (fStack_40c * fVar265 + fVar263);
          fVar256 = local_568 * fVar125 - ((float)local_3f8._0_4_ * fVar245 + fVar315);
          fVar257 = fStack_564 * fVar158 - ((float)local_3f8._4_4_ * fVar246 + fVar316);
          fVar258 = fStack_560 * fVar159 - ((float)local_3f8._8_4_ * fVar264 + fVar317);
          fVar263 = fStack_55c * fVar160 - ((float)local_3f8._12_4_ * fVar265 + fVar321);
          bVar76 = 0.0 <= auVar311._0_4_;
          uVar77 = -(uint)bVar76;
          bVar21 = 0.0 <= auVar311._4_4_;
          uVar78 = -(uint)bVar21;
          bVar22 = 0.0 <= auVar311._8_4_;
          uVar79 = -(uint)bVar22;
          bVar23 = 0.0 <= auVar311._12_4_;
          uVar80 = -(uint)bVar23;
          auVar203._0_4_ = fVar121 * fVar125 - (fVar245 * (float)local_408._0_4_ + fVar301);
          auVar203._4_4_ = fVar121 * fVar158 - (fVar246 * (float)local_408._4_4_ + fVar302);
          auVar203._8_4_ = fVar121 * fVar159 - (fVar264 * fStack_400 + fVar303);
          auVar203._12_4_ = fVar121 * fVar160 - (fVar265 * fStack_3fc + fVar314);
          auVar240._0_4_ = (uint)fVar322 & uVar77;
          auVar240._4_4_ = (uint)fVar276 & uVar78;
          auVar240._8_4_ = (uint)fVar277 & uVar79;
          auVar240._12_4_ = (uint)fVar279 & uVar80;
          auVar253._0_8_ = CONCAT44(~uVar78,~uVar77) & 0x7f8000007f800000;
          auVar253._8_4_ = ~uVar79 & 0x7f800000;
          auVar253._12_4_ = ~uVar80 & 0x7f800000;
          auVar253 = auVar253 | auVar240;
          auVar223._0_4_ = (uint)fVar125 & uVar77;
          auVar223._4_4_ = (uint)fVar158 & uVar78;
          auVar223._8_4_ = (uint)fVar159 & uVar79;
          auVar223._12_4_ = (uint)fVar160 & uVar80;
          auVar241._0_8_ = CONCAT44(~uVar78,~uVar77) & 0xff800000ff800000;
          auVar241._8_4_ = ~uVar79 & 0xff800000;
          auVar241._12_4_ = ~uVar80 & 0xff800000;
          auVar241 = auVar241 | auVar223;
          auVar224._0_8_ = CONCAT44(fStack_174,local_178) & 0x7fffffff7fffffff;
          auVar224._8_4_ = ABS(fStack_170);
          auVar224._12_4_ = ABS(fStack_16c);
          auVar34._4_4_ = fStack_374;
          auVar34._0_4_ = local_378;
          auVar34._8_4_ = fStack_370;
          auVar34._12_4_ = fStack_36c;
          auVar84 = maxps(auVar34,auVar224);
          fVar245 = auVar84._0_4_ * 1.9073486e-06;
          fVar246 = auVar84._4_4_ * 1.9073486e-06;
          fVar264 = auVar84._8_4_ * 1.9073486e-06;
          fVar265 = auVar84._12_4_ * 1.9073486e-06;
          auVar225._0_4_ = -(uint)(ABS(fVar278) < fVar245 && bVar76);
          auVar225._4_4_ = -(uint)(ABS(fVar288) < fVar246 && bVar21);
          auVar225._8_4_ = -(uint)(ABS(fVar290) < fVar264 && bVar22);
          auVar225._12_4_ = -(uint)(ABS(fVar293) < fVar265 && bVar23);
          iVar60 = movmskps(iVar60,auVar225);
          if (iVar60 != 0) {
            uVar77 = -(uint)(auVar169._0_4_ <= 0.0);
            uVar78 = -(uint)(auVar169._4_4_ <= 0.0);
            uVar79 = -(uint)(auVar169._8_4_ <= 0.0);
            uVar80 = -(uint)(auVar169._12_4_ <= 0.0);
            auVar286._0_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar225._0_4_;
            auVar286._4_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar225._4_4_;
            auVar286._8_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar225._8_4_;
            auVar286._12_4_ = (uVar80 & 0xff800000 | ~uVar80 & 0x7f800000) & auVar225._12_4_;
            auVar325._0_4_ = ~auVar225._0_4_ & auVar253._0_4_;
            auVar325._4_4_ = ~auVar225._4_4_ & auVar253._4_4_;
            auVar325._8_4_ = ~auVar225._8_4_ & auVar253._8_4_;
            auVar325._12_4_ = ~auVar225._12_4_ & auVar253._12_4_;
            auVar253 = auVar325 | auVar286;
            auVar287._0_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar225._0_4_;
            auVar287._4_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar225._4_4_;
            auVar287._8_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar225._8_4_;
            auVar287._12_4_ = (uVar80 & 0x7f800000 | ~uVar80 & 0xff800000) & auVar225._12_4_;
            auVar230._0_4_ = ~auVar225._0_4_ & auVar241._0_4_;
            auVar230._4_4_ = ~auVar225._4_4_ & auVar241._4_4_;
            auVar230._8_4_ = ~auVar225._8_4_ & auVar241._8_4_;
            auVar230._12_4_ = ~auVar225._12_4_ & auVar241._12_4_;
            auVar241 = auVar230 | auVar287;
            local_508._4_4_ = -(uint)((fVar246 <= ABS(fVar288) || auVar169._4_4_ <= 0.0) && bVar21);
            local_508._0_4_ = -(uint)((fVar245 <= ABS(fVar278) || auVar169._0_4_ <= 0.0) && bVar76);
            fStack_500 = (float)-(uint)((fVar264 <= ABS(fVar290) || auVar169._8_4_ <= 0.0) && bVar22
                                       );
            fStack_4fc = (float)-(uint)((fVar265 <= ABS(fVar293) || auVar169._12_4_ <= 0.0) &&
                                       bVar23);
          }
        }
        local_4f8._4_4_ =
             -(uint)(0.3 <= ABS(fVar204 * fStack_574 +
                                fVar257 * fStack_564 + auVar203._4_4_ * fVar121));
        local_4f8._0_4_ =
             -(uint)(0.3 <= ABS(fVar201 * local_578 + fVar256 * local_568 + auVar203._0_4_ * fVar121
                               ));
        fStack_4f0 = (float)-(uint)(0.3 <= ABS(fVar205 * fStack_570 +
                                               fVar258 * fStack_560 + auVar203._8_4_ * fVar121));
        fStack_4ec = (float)-(uint)(0.3 <= ABS(fVar206 * fStack_56c +
                                               fVar263 * fStack_55c + auVar203._12_4_ * fVar121));
        _local_138 = auVar164;
        local_128 = minps(auVar236,auVar253);
        _local_228 = maxps(auVar164,auVar241);
        local_218 = auVar236;
        auVar186._0_4_ = -(uint)(fVar124 <= local_128._0_4_) & auVar142._0_4_;
        auVar186._4_4_ = -(uint)(fVar177 <= local_128._4_4_) & auVar142._4_4_;
        auVar186._8_4_ = -(uint)(fVar199 <= local_128._8_4_) & auVar142._8_4_;
        auVar186._12_4_ = -(uint)(fVar200 <= local_128._12_4_) & auVar142._12_4_;
        fVar201 = local_228._0_4_;
        fVar204 = local_228._4_4_;
        fVar205 = local_228._8_4_;
        fVar206 = local_228._12_4_;
        local_3f8._0_8_ =
             CONCAT44(-(uint)(fVar204 <= auVar236._4_4_) & auVar142._4_4_,
                      -(uint)(fVar201 <= auVar236._0_4_) & auVar142._0_4_);
        local_3f8._8_4_ = -(uint)(fVar205 <= auVar236._8_4_) & auVar142._8_4_;
        local_3f8._12_4_ = -(uint)(fVar206 <= auVar236._12_4_) & auVar142._12_4_;
        auVar143._8_4_ = local_3f8._8_4_;
        auVar143._0_8_ = local_3f8._0_8_;
        auVar143._12_4_ = local_3f8._12_4_;
        iVar60 = movmskps(iVar60,auVar143 | auVar186);
        if (iVar60 != 0) {
          local_418 = fVar122;
          fStack_414 = fVar122;
          fStack_410 = fVar122;
          fStack_40c = fVar122;
          local_598._0_4_ =
               -(uint)((int)fVar122 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_598._0_4_ * fVar121 +
                                                 local_698 * local_568 + fVar231 * local_578)) &
                             local_508._0_4_) << 0x1f) >> 0x1f) + 4);
          local_598._4_4_ =
               -(uint)((int)fVar122 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_598._4_4_ * fVar121 +
                                                 fStack_694 * fStack_564 + fVar232 * fStack_574)) &
                             local_508._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_590 = (float)-(uint)((int)fVar122 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_590 * fVar121 +
                                                                fStack_690 * fStack_560 +
                                                                fVar233 * fStack_570)) &
                                            (uint)fStack_500) << 0x1f) >> 0x1f) + 4);
          fStack_58c = (float)-(uint)((int)fVar122 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_58c * fVar121 +
                                                                fStack_68c * fStack_55c +
                                                                fVar244 * fStack_56c)) &
                                            (uint)fStack_4fc) << 0x1f) >> 0x1f) + 4);
          local_3c8 = ~_local_598 & auVar186;
          iVar60 = movmskps(iVar60,local_3c8);
          _local_408 = auVar186;
          fVar231 = fVar201;
          fVar232 = fVar204;
          fVar233 = fVar205;
          fVar244 = fVar206;
          if (iVar60 != 0) {
            local_558 = fVar174 + fVar124;
            fStack_554 = fVar174 + fVar177;
            fStack_550 = fVar174 + fVar199;
            fStack_54c = fVar174 + fVar200;
            do {
              auVar270 = ~local_3c8 & _DAT_01f7a9f0 | local_3c8 & auVar164;
              auVar187._4_4_ = auVar270._0_4_;
              auVar187._0_4_ = auVar270._4_4_;
              auVar187._8_4_ = auVar270._12_4_;
              auVar187._12_4_ = auVar270._8_4_;
              auVar84 = minps(auVar187,auVar270);
              auVar144._0_8_ = auVar84._8_8_;
              auVar144._8_4_ = auVar84._0_4_;
              auVar144._12_4_ = auVar84._4_4_;
              auVar84 = minps(auVar144,auVar84);
              auVar145._0_8_ =
                   CONCAT44(-(uint)(auVar84._4_4_ == auVar270._4_4_) & local_3c8._4_4_,
                            -(uint)(auVar84._0_4_ == auVar270._0_4_) & local_3c8._0_4_);
              auVar145._8_4_ = -(uint)(auVar84._8_4_ == auVar270._8_4_) & local_3c8._8_4_;
              auVar145._12_4_ = -(uint)(auVar84._12_4_ == auVar270._12_4_) & local_3c8._12_4_;
              iVar60 = movmskps(iVar60,auVar145);
              auVar109 = local_3c8;
              if (iVar60 != 0) {
                auVar109._8_4_ = auVar145._8_4_;
                auVar109._0_8_ = auVar145._0_8_;
                auVar109._12_4_ = auVar145._12_4_;
              }
              uVar61 = movmskps(iVar60,auVar109);
              lVar67 = 0;
              if (CONCAT44(uVar68,uVar61) != 0) {
                for (; (CONCAT44(uVar68,uVar61) >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                }
              }
              *(undefined4 *)(local_3c8 + lVar67 * 4) = 0;
              auVar31._4_4_ = fStack_424;
              auVar31._0_4_ = local_428;
              auVar31._8_4_ = fStack_420;
              auVar31._12_4_ = fStack_41c;
              auVar29._4_4_ = fStack_434;
              auVar29._0_4_ = local_438;
              auVar29._8_4_ = fStack_430;
              auVar29._12_4_ = fStack_42c;
              auVar270 = minps(auVar31,auVar29);
              auVar236 = maxps(auVar31,auVar29);
              auVar27._4_4_ = fStack_444;
              auVar27._0_4_ = local_448;
              auVar27._8_4_ = fStack_440;
              auVar27._12_4_ = fStack_43c;
              auVar84 = minps(auVar27,_local_548);
              auVar270 = minps(auVar270,auVar84);
              auVar84 = maxps(auVar27,_local_548);
              auVar84 = maxps(auVar236,auVar84);
              auVar188._0_8_ = auVar270._0_8_ & 0x7fffffff7fffffff;
              auVar188._8_4_ = auVar270._8_4_ & 0x7fffffff;
              auVar188._12_4_ = auVar270._12_4_ & 0x7fffffff;
              local_4e8 = auVar84._12_4_;
              auVar110._0_8_ = auVar84._0_8_ & 0x7fffffff7fffffff;
              auVar110._8_4_ = auVar84._8_4_ & 0x7fffffff;
              auVar110._12_4_ = ABS(local_4e8);
              auVar84 = maxps(auVar188,auVar110);
              fVar124 = auVar84._4_4_;
              if (auVar84._4_4_ <= auVar84._0_4_) {
                fVar124 = auVar84._0_4_;
              }
              auVar189._8_8_ = auVar84._8_8_;
              auVar189._0_8_ = auVar84._8_8_;
              if (auVar84._8_4_ <= fVar124) {
                auVar189._0_4_ = fVar124;
              }
              fVar199 = auVar189._0_4_ * 1.9073486e-06;
              fStack_4e4 = local_4e8;
              fStack_4e0 = local_4e8;
              fStack_4dc = local_4e8;
              fVar124 = local_108[lVar67];
              fVar177 = *(float *)(local_138 + lVar67 * 4);
              bVar76 = true;
              uVar73 = 0;
              do {
                fVar232 = SQRT(fVar123) * 1.9073486e-06 * fVar177;
                fVar231 = 1.0 - fVar124;
                fVar244 = fVar124 * 3.0;
                fVar200 = -fVar124 * fVar231 * fVar231 * 0.5;
                fVar265 = (fVar124 * fVar124 * (fVar244 + -5.0) + 2.0) * 0.5;
                fVar264 = ((fVar231 * 3.0 + -5.0) * fVar231 * fVar231 + 2.0) * 0.5;
                fVar125 = -fVar231 * fVar124 * fVar124 * 0.5;
                fVar233 = fVar200 * fStack_41c +
                          fVar265 * fStack_42c + fVar264 * fStack_43c + fVar125 * fStack_53c;
                fVar256 = (fVar124 * (fVar231 + fVar231) - fVar231 * fVar231) * 0.5;
                fVar246 = ((fVar124 + fVar124) * (fVar244 + -5.0) + fVar124 * fVar244) * 0.5;
                fVar245 = ((fVar244 + 2.0) * (fVar231 + fVar231) + fVar231 * -3.0 * fVar231) * 0.5;
                fVar231 = (fVar231 * -2.0 * fVar124 + fVar124 * fVar124) * 0.5;
                fVar158 = fVar256 * local_428 +
                          fVar246 * local_438 +
                          fVar245 * local_448 + fVar231 * (float)local_548._0_4_;
                fVar159 = fVar256 * fStack_424 +
                          fVar246 * fStack_434 +
                          fVar245 * fStack_444 + fVar231 * (float)local_548._4_4_;
                fVar160 = fVar256 * fStack_420 +
                          fVar246 * fStack_430 + fVar245 * fStack_440 + fVar231 * fStack_540;
                fVar162 = fVar256 * fStack_41c +
                          fVar246 * fStack_42c + fVar245 * fStack_43c + fVar231 * fStack_53c;
                fVar245 = fVar124 * -3.0 + 2.0;
                fVar256 = fVar124 * 9.0 + -5.0;
                fVar231 = fVar124 * -9.0 + 4.0;
                fVar244 = fVar244 + -1.0;
                fVar246 = fVar245 * local_428 +
                          fVar256 * local_438 +
                          fVar231 * local_448 + fVar244 * (float)local_548._0_4_;
                fVar257 = fVar245 * fStack_424 +
                          fVar256 * fStack_434 +
                          fVar231 * fStack_444 + fVar244 * (float)local_548._4_4_;
                fVar263 = fVar245 * fStack_420 +
                          fVar256 * fStack_430 + fVar231 * fStack_440 + fVar244 * fStack_540;
                fVar256 = (fVar177 * fVar175 + 0.0) -
                          (fVar200 * local_428 +
                          fVar265 * local_438 +
                          fVar264 * local_448 + fVar125 * (float)local_548._0_4_);
                fVar258 = (fVar177 * fVar82 + 0.0) -
                          (fVar200 * fStack_424 +
                          fVar265 * fStack_434 +
                          fVar264 * fStack_444 + fVar125 * (float)local_548._4_4_);
                fVar264 = (fVar177 * fVar121 + 0.0) -
                          (fVar200 * fStack_420 +
                          fVar265 * fStack_430 + fVar264 * fStack_440 + fVar125 * fStack_540);
                fVar231 = (fVar177 * 0.0 + 0.0) - fVar233;
                fVar200 = fVar258 * fVar258;
                fVar244 = fVar264 * fVar264;
                fVar245 = fVar231 * fVar231;
                auVar312._0_4_ = fVar200 + fVar256 * fVar256 + fVar244;
                auVar312._4_4_ = fVar200 + fVar200 + fVar245;
                auVar312._8_4_ = fVar200 + fVar244 + fVar244;
                auVar312._12_4_ = fVar200 + fVar245 + fVar245;
                local_5c8._4_4_ = auVar189._4_4_;
                fStack_5c0 = auVar189._8_4_;
                fStack_5bc = auVar189._12_4_;
                fVar200 = fVar199;
                if (fVar199 <= fVar232) {
                  fVar200 = fVar232;
                }
                fVar265 = fVar159 * fVar159 + fVar158 * fVar158 + fVar160 * fVar160;
                auVar270 = ZEXT416((uint)fVar265);
                auVar84 = rsqrtss(ZEXT416((uint)fVar265),auVar270);
                fVar232 = auVar84._0_4_;
                fVar125 = fVar232 * 1.5 - fVar232 * fVar232 * fVar265 * 0.5 * fVar232;
                fVar278 = fVar158 * fVar125;
                fVar288 = fVar159 * fVar125;
                fVar290 = fVar160 * fVar125;
                fVar293 = fVar162 * fVar125;
                fVar176 = fVar263 * fVar160 + fVar257 * fVar159 + fVar246 * fVar158;
                auVar84 = rcpss(auVar270,auVar270);
                fVar244 = (2.0 - fVar265 * auVar84._0_4_) * auVar84._0_4_;
                fVar232 = fVar258 * fVar288;
                fVar274 = fVar264 * fVar290;
                fVar275 = fVar231 * fVar293;
                fVar300 = fVar232 + fVar256 * fVar278 + fVar274;
                fVar301 = fVar232 + fVar232 + fVar275;
                fVar274 = fVar232 + fVar274 + fVar274;
                fVar275 = fVar232 + fVar275 + fVar275;
                fVar232 = (SQRT(auVar312._0_4_) + 1.0) * (fVar199 / SQRT(fVar265)) +
                          SQRT(auVar312._0_4_) * fVar199 + fVar200;
                fVar245 = fVar293 * 0.0;
                fVar293 = fVar293 * -fVar162;
                fVar265 = fVar290 * -fVar160 + fVar288 * -fVar159 + fVar278 * -fVar158 +
                          fVar244 * (fVar265 * fVar263 - fVar176 * fVar160) * fVar125 * fVar264 +
                          fVar244 * (fVar265 * fVar257 - fVar176 * fVar159) * fVar125 * fVar258 +
                          fVar244 * (fVar265 * fVar246 - fVar176 * fVar158) * fVar125 * fVar256;
                fVar244 = fVar121 * fVar290 + fVar82 * fVar288 + fVar175 * fVar278;
                fVar257 = auVar312._0_4_ - fVar300 * fVar300;
                auVar111._0_8_ = CONCAT44(auVar312._4_4_ - fVar301 * fVar301,fVar257);
                auVar111._8_4_ = auVar312._8_4_ - fVar274 * fVar274;
                auVar111._12_4_ = auVar312._12_4_ - fVar275 * fVar275;
                fVar125 = -fVar162 * fVar231;
                local_618 = CONCAT44(fVar293,fVar265);
                fVar231 = fVar231 * 0.0;
                fVar246 = (fVar121 * fVar264 + fVar82 * fVar258 + fVar175 * fVar256) -
                          fVar300 * fVar244;
                auVar146._8_4_ = auVar111._8_4_;
                auVar146._0_8_ = auVar111._0_8_;
                auVar146._12_4_ = auVar111._12_4_;
                auVar84 = rsqrtss(auVar146,auVar111);
                fVar263 = auVar84._0_4_;
                auVar190._0_4_ = fVar263 * 1.5 - fVar263 * fVar263 * fVar257 * 0.5 * fVar263;
                auVar190._4_12_ = auVar84._4_12_;
                if (fVar257 < 0.0) {
                  fStack_484 = local_5c8._4_4_;
                  fStack_480 = fStack_5c0;
                  fStack_47c = fStack_5bc;
                  local_498._0_4_ = fVar232;
                  _local_4d8 = auVar190;
                  local_4c8 = fVar246;
                  fStack_4c4 = fVar231;
                  fStack_4c0 = fVar121 * fVar264;
                  fStack_4bc = fVar231;
                  local_4b8 = fVar244;
                  fStack_4b4 = fVar245;
                  fStack_4b0 = fVar121 * fVar290;
                  fStack_4ac = fVar245;
                  local_4a8 = fVar300;
                  fStack_4a4 = fVar301;
                  fStack_4a0 = fVar274;
                  fStack_49c = fVar275;
                  local_488 = fVar200;
                  _local_478 = auVar312;
                  fVar257 = sqrtf(fVar257);
                  auVar190 = _local_4d8;
                  auVar312 = _local_478;
                  fVar232 = (float)local_498._0_4_;
                  fVar200 = local_488;
                  fVar244 = local_4b8;
                  fVar245 = fStack_4b4;
                  fVar263 = local_4a8;
                  fVar246 = local_4c8;
                  fVar231 = fStack_4c4;
                }
                else {
                  fVar257 = SQRT(fVar257);
                  fVar263 = fVar300;
                }
                fVar257 = fVar257 - fVar233;
                fVar233 = ((-fVar160 * fVar264 + -fVar159 * fVar258 + -fVar158 * fVar256) -
                          fVar300 * fVar265) * auVar190._0_4_ - fVar162;
                fVar246 = fVar246 * auVar190._0_4_;
                auVar191._0_4_ = fVar265 * fVar246 - fVar244 * fVar233;
                auVar227._8_4_ = -fVar125;
                auVar227._0_8_ = CONCAT44(fVar125,fVar233) ^ 0x8000000000000000;
                auVar227._12_4_ = fVar231;
                auVar226._8_8_ = auVar227._8_8_;
                auVar226._0_8_ = CONCAT44(fVar246,fVar233) ^ 0x80000000;
                auVar191._4_4_ = auVar191._0_4_;
                auVar191._8_4_ = auVar191._0_4_;
                auVar191._12_4_ = auVar191._0_4_;
                auVar84 = divps(auVar226,auVar191);
                auVar243._8_4_ = fVar293;
                auVar243._0_8_ = local_618;
                auVar243._12_4_ = -fVar245;
                auVar242._8_8_ = auVar243._8_8_;
                auVar242._0_8_ = CONCAT44(fVar244,fVar265) ^ 0x8000000000000000;
                auVar270 = divps(auVar242,auVar191);
                fVar177 = fVar177 - (fVar257 * auVar270._0_4_ + fVar263 * auVar84._0_4_);
                fVar124 = fVar124 - (fVar257 * auVar270._4_4_ + fVar263 * auVar84._4_4_);
                if ((ABS(fVar263) < fVar232) &&
                   (ABS(fVar257) < local_4e8 * 1.9073486e-06 + fVar200 + fVar232)) {
                  fVar177 = (float)local_3e8._0_4_ + fVar177;
                  if ((fVar83 <= fVar177) &&
                     (fVar199 = *(float *)(ray + k * 4 + 0x80), fVar177 <= fVar199)) {
                    uVar63 = 0;
                    if ((fVar124 < 0.0) || (1.0 < fVar124)) goto LAB_00b42c9e;
                    auVar84 = rsqrtss(auVar312,auVar312);
                    fVar200 = auVar84._0_4_;
                    pGVar18 = (context->scene->geometries).items[local_460].ptr;
                    pRVar69 = (RTCIntersectArguments *)context;
                    if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (uVar63 = CONCAT71((int7)((ulong)context->args >> 8),1),
                         pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar200 = fVar200 * 1.5 +
                                  fVar200 * fVar200 * auVar312._0_4_ * -0.5 * fVar200;
                        fVar256 = fVar256 * fVar200;
                        fVar258 = fVar258 * fVar200;
                        fVar264 = fVar264 * fVar200;
                        fVar200 = fVar162 * fVar256 + fVar158;
                        fVar231 = fVar162 * fVar258 + fVar159;
                        fVar232 = fVar162 * fVar264 + fVar160;
                        fVar233 = fVar258 * fVar158 - fVar159 * fVar256;
                        fVar244 = fVar264 * fVar159 - fVar160 * fVar258;
                        fVar245 = fVar256 * fVar160 - fVar158 * fVar264;
                        local_298 = fVar244 * fVar231 - fVar245 * fVar200;
                        local_2b8._4_4_ = fVar245 * fVar232 - fVar233 * fVar231;
                        local_2a8 = fVar233 * fVar200 - fVar244 * fVar232;
                        local_2b8._0_4_ = local_2b8._4_4_;
                        fStack_2b0 = (float)local_2b8._4_4_;
                        fStack_2ac = (float)local_2b8._4_4_;
                        fStack_2a4 = local_2a8;
                        fStack_2a0 = local_2a8;
                        fStack_29c = local_2a8;
                        fStack_294 = local_298;
                        fStack_290 = local_298;
                        fStack_28c = local_298;
                        local_288 = fVar124;
                        fStack_284 = fVar124;
                        fStack_280 = fVar124;
                        fStack_27c = fVar124;
                        local_278 = 0;
                        uStack_274 = 0;
                        uStack_270 = 0;
                        uStack_26c = 0;
                        local_268 = CONCAT44(uStack_3a4,local_3a8);
                        uStack_260 = CONCAT44(uStack_39c,uStack_3a0);
                        local_258 = CONCAT44(uStack_394,local_398);
                        uStack_250 = CONCAT44(uStack_38c,uStack_390);
                        local_248 = context->user->instID[0];
                        uStack_244 = local_248;
                        uStack_240 = local_248;
                        uStack_23c = local_248;
                        local_238 = context->user->instPrimID[0];
                        uStack_234 = local_238;
                        uStack_230 = local_238;
                        uStack_22c = local_238;
                        *(float *)(ray + k * 4 + 0x80) = fVar177;
                        local_5a8 = *local_468;
                        _local_538 = (int *)local_5a8;
                        uStack_530 = pGVar18->userPtr;
                        local_528 = context->user;
                        local_520 = ray;
                        local_518 = (RTCHitN *)local_2b8;
                        local_510 = 4;
                        p_Var65 = pGVar18->occlusionFilterN;
                        if (p_Var65 != (RTCFilterFunctionN)0x0) {
                          p_Var65 = (RTCFilterFunctionN)
                                    (*p_Var65)((RTCFilterFunctionNArguments *)local_538);
                        }
                        auVar147._0_4_ = -(uint)(local_5a8._0_4_ == 0);
                        auVar147._4_4_ = -(uint)(local_5a8._4_4_ == 0);
                        auVar147._8_4_ = -(uint)(local_5a8._8_4_ == 0);
                        auVar147._12_4_ = -(uint)(local_5a8._12_4_ == 0);
                        uVar77 = movmskps((int)p_Var65,auVar147);
                        pRVar64 = (RayK<4> *)(ulong)(uVar77 ^ 0xf);
                        if ((uVar77 ^ 0xf) == 0) {
                          auVar147 = auVar147 ^ _DAT_01f7ae20;
                        }
                        else {
                          pRVar69 = context->args;
                          if (((RTCIntersectArguments *)pRVar69->filter !=
                               (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar69->flags & 2) != 0 ||
                              (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                            (*(code *)pRVar69->filter)(local_538);
                          }
                          auVar112._0_4_ = -(uint)(local_5a8._0_4_ == 0);
                          auVar112._4_4_ = -(uint)(local_5a8._4_4_ == 0);
                          auVar112._8_4_ = -(uint)(local_5a8._8_4_ == 0);
                          auVar112._12_4_ = -(uint)(local_5a8._12_4_ == 0);
                          auVar147 = auVar112 ^ _DAT_01f7ae20;
                          *(undefined1 (*) [16])(local_520 + 0x80) =
                               ~auVar112 & _DAT_01f7aa00 |
                               *(undefined1 (*) [16])(local_520 + 0x80) & auVar112;
                          pRVar64 = local_520;
                        }
                        auVar148._0_4_ = auVar147._0_4_ << 0x1f;
                        auVar148._4_4_ = auVar147._4_4_ << 0x1f;
                        auVar148._8_4_ = auVar147._8_4_ << 0x1f;
                        auVar148._12_4_ = auVar147._12_4_ << 0x1f;
                        iVar60 = movmskps((int)pRVar64,auVar148);
                        uVar63 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar64 >> 0x20),iVar60) >> 8
                                                ),iVar60 != 0);
                        if (iVar60 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar199;
                        }
                      }
                      goto LAB_00b42c9e;
                    }
                  }
                  uVar63 = 0;
                  goto LAB_00b42c9e;
                }
                bVar76 = uVar73 < 4;
                uVar73 = uVar73 + 1;
              } while (uVar73 != 5);
              bVar76 = false;
              uVar63 = 5;
LAB_00b42c9e:
              fVar300 = *(float *)(ray + k * 4 + 0x80);
              local_3c8._0_4_ = -(uint)(local_558 <= fVar300) & local_3c8._0_4_;
              local_3c8._4_4_ = -(uint)(fStack_554 <= fVar300) & local_3c8._4_4_;
              local_3c8._8_4_ = -(uint)(fStack_550 <= fVar300) & local_3c8._8_4_;
              local_3c8._12_4_ = -(uint)(fStack_54c <= fVar300) & local_3c8._12_4_;
              bVar71 = (bool)(bVar71 | bVar76 & (byte)uVar63);
              uVar68 = (undefined4)((ulong)uVar63 >> 0x20);
              iVar60 = movmskps((int)uVar63,local_3c8);
            } while (iVar60 != 0);
            fVar231 = (float)local_228._0_4_;
            fVar232 = (float)local_228._4_4_;
            fVar233 = fStack_220;
            fVar244 = fStack_21c;
          }
          uVar61 = SUB84(pRVar69,0);
          auVar149._0_4_ = -(uint)(fVar201 + fVar174 <= fVar300) & local_3f8._0_4_;
          auVar149._4_4_ = -(uint)(fVar204 + fVar174 <= fVar300) & local_3f8._4_4_;
          auVar149._8_4_ = -(uint)(fVar205 + fVar174 <= fVar300) & local_3f8._8_4_;
          auVar149._12_4_ = -(uint)(fVar206 + fVar174 <= fVar300) & local_3f8._12_4_;
          local_4f8._0_4_ =
               -(uint)((int)local_418 <
                      ((int)((local_4f8._0_4_ & local_508._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4f8._4_4_ =
               -(uint)((int)fStack_414 <
                      ((int)((local_4f8._4_4_ & local_508._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4f0 = (float)-(uint)((int)fStack_410 <
                                     ((int)(((uint)fStack_4f0 & (uint)fStack_500) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_4ec = (float)-(uint)((int)fStack_40c <
                                     ((int)(((uint)fStack_4ec & (uint)fStack_4fc) << 0x1f) >> 0x1f)
                                     + 4);
          local_3d8 = ~_local_4f8 & auVar149;
          iVar60 = movmskps(0,local_3d8);
          if (iVar60 != 0) {
            local_558 = fVar174 + fVar231;
            fStack_554 = fVar174 + fVar232;
            fStack_550 = fVar174 + fVar233;
            fStack_54c = fVar174 + fVar244;
            do {
              uVar77 = local_3d8._0_4_;
              uVar78 = local_3d8._4_4_;
              uVar79 = local_3d8._8_4_;
              uVar80 = local_3d8._12_4_;
              auVar150._0_4_ = uVar77 & (uint)fVar231;
              auVar150._4_4_ = uVar78 & (uint)fVar232;
              auVar150._8_4_ = uVar79 & (uint)fVar233;
              auVar150._12_4_ = uVar80 & (uint)fVar244;
              auVar170._0_8_ = CONCAT44(~uVar78,~uVar77) & 0x7f8000007f800000;
              auVar170._8_4_ = ~uVar79 & 0x7f800000;
              auVar170._12_4_ = ~uVar80 & 0x7f800000;
              auVar170 = auVar170 | auVar150;
              auVar192._4_4_ = auVar170._0_4_;
              auVar192._0_4_ = auVar170._4_4_;
              auVar192._8_4_ = auVar170._12_4_;
              auVar192._12_4_ = auVar170._8_4_;
              auVar84 = minps(auVar192,auVar170);
              auVar151._0_8_ = auVar84._8_8_;
              auVar151._8_4_ = auVar84._0_4_;
              auVar151._12_4_ = auVar84._4_4_;
              auVar84 = minps(auVar151,auVar84);
              auVar152._0_8_ =
                   CONCAT44(-(uint)(auVar84._4_4_ == auVar170._4_4_) & uVar78,
                            -(uint)(auVar84._0_4_ == auVar170._0_4_) & uVar77);
              auVar152._8_4_ = -(uint)(auVar84._8_4_ == auVar170._8_4_) & uVar79;
              auVar152._12_4_ = -(uint)(auVar84._12_4_ == auVar170._12_4_) & uVar80;
              iVar60 = movmskps(iVar60,auVar152);
              auVar113 = local_3d8;
              if (iVar60 != 0) {
                auVar113._8_4_ = auVar152._8_4_;
                auVar113._0_8_ = auVar152._0_8_;
                auVar113._12_4_ = auVar152._12_4_;
              }
              uVar61 = movmskps(iVar60,auVar113);
              lVar67 = 0;
              if (CONCAT44(uVar68,uVar61) != 0) {
                for (; (CONCAT44(uVar68,uVar61) >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                }
              }
              *(undefined4 *)(local_3d8 + lVar67 * 4) = 0;
              auVar32._4_4_ = fStack_424;
              auVar32._0_4_ = local_428;
              auVar32._8_4_ = fStack_420;
              auVar32._12_4_ = fStack_41c;
              auVar30._4_4_ = fStack_434;
              auVar30._0_4_ = local_438;
              auVar30._8_4_ = fStack_430;
              auVar30._12_4_ = fStack_42c;
              auVar164 = minps(auVar32,auVar30);
              auVar270 = maxps(auVar32,auVar30);
              auVar28._4_4_ = fStack_444;
              auVar28._0_4_ = local_448;
              auVar28._8_4_ = fStack_440;
              auVar28._12_4_ = fStack_43c;
              auVar84 = minps(auVar28,_local_548);
              auVar164 = minps(auVar164,auVar84);
              auVar84 = maxps(auVar28,_local_548);
              auVar84 = maxps(auVar270,auVar84);
              auVar193._0_8_ = auVar164._0_8_ & 0x7fffffff7fffffff;
              auVar193._8_4_ = auVar164._8_4_ & 0x7fffffff;
              auVar193._12_4_ = auVar164._12_4_ & 0x7fffffff;
              local_4e8 = auVar84._12_4_;
              auVar114._0_8_ = auVar84._0_8_ & 0x7fffffff7fffffff;
              auVar114._8_4_ = auVar84._8_4_ & 0x7fffffff;
              auVar114._12_4_ = ABS(local_4e8);
              auVar84 = maxps(auVar193,auVar114);
              fVar124 = auVar84._4_4_;
              if (auVar84._4_4_ <= auVar84._0_4_) {
                fVar124 = auVar84._0_4_;
              }
              auVar194._8_8_ = auVar84._8_8_;
              auVar194._0_8_ = auVar84._8_8_;
              if (auVar84._8_4_ <= fVar124) {
                auVar194._0_4_ = fVar124;
              }
              register0x000012c4 = auVar194._4_12_;
              local_478._0_4_ = auVar194._0_4_ * 1.9073486e-06;
              fStack_4e4 = local_4e8;
              fStack_4e0 = local_4e8;
              fStack_4dc = local_4e8;
              fVar124 = local_118[lVar67];
              fVar177 = *(float *)(local_218 + lVar67 * 4);
              bVar76 = true;
              uVar73 = 0;
              do {
                fVar204 = SQRT(fVar123) * 1.9073486e-06 * fVar177;
                fVar200 = 1.0 - fVar124;
                fVar206 = fVar124 * 3.0;
                fVar199 = -fVar124 * fVar200 * fVar200 * 0.5;
                fVar265 = (fVar124 * fVar124 * (fVar206 + -5.0) + 2.0) * 0.5;
                fVar264 = ((fVar200 * 3.0 + -5.0) * fVar200 * fVar200 + 2.0) * 0.5;
                fVar160 = -fVar200 * fVar124 * fVar124 * 0.5;
                fVar205 = fVar199 * fStack_41c +
                          fVar265 * fStack_42c + fVar264 * fStack_43c + fVar160 * fStack_53c;
                fVar246 = (fVar124 * (fVar200 + fVar200) - fVar200 * fVar200) * 0.5;
                fVar245 = ((fVar124 + fVar124) * (fVar206 + -5.0) + fVar124 * fVar206) * 0.5;
                fVar201 = ((fVar206 + 2.0) * (fVar200 + fVar200) + fVar200 * -3.0 * fVar200) * 0.5;
                fVar200 = (fVar200 * -2.0 * fVar124 + fVar124 * fVar124) * 0.5;
                fVar125 = fVar246 * local_428 +
                          fVar245 * local_438 +
                          fVar201 * local_448 + fVar200 * (float)local_548._0_4_;
                fVar158 = fVar246 * fStack_424 +
                          fVar245 * fStack_434 +
                          fVar201 * fStack_444 + fVar200 * (float)local_548._4_4_;
                fVar159 = fVar246 * fStack_420 +
                          fVar245 * fStack_430 + fVar201 * fStack_440 + fVar200 * fStack_540;
                fVar200 = fVar246 * fStack_41c +
                          fVar245 * fStack_42c + fVar201 * fStack_43c + fVar200 * fStack_53c;
                fVar245 = fVar124 * -3.0 + 2.0;
                fVar256 = fVar124 * 9.0 + -5.0;
                fVar201 = fVar124 * -9.0 + 4.0;
                fVar206 = fVar206 + -1.0;
                fVar246 = fVar245 * local_428 +
                          fVar256 * local_438 +
                          fVar201 * local_448 + fVar206 * (float)local_548._0_4_;
                fVar257 = fVar245 * fStack_424 +
                          fVar256 * fStack_434 +
                          fVar201 * fStack_444 + fVar206 * (float)local_548._4_4_;
                fVar263 = fVar245 * fStack_420 +
                          fVar256 * fStack_430 + fVar201 * fStack_440 + fVar206 * fStack_540;
                fVar256 = (fVar177 * fVar175 + 0.0) -
                          (fVar199 * local_428 +
                          fVar265 * local_438 +
                          fVar264 * local_448 + fVar160 * (float)local_548._0_4_);
                fVar258 = (fVar177 * fVar82 + 0.0) -
                          (fVar199 * fStack_424 +
                          fVar265 * fStack_434 +
                          fVar264 * fStack_444 + fVar160 * (float)local_548._4_4_);
                fVar264 = (fVar177 * fVar121 + 0.0) -
                          (fVar199 * fStack_420 +
                          fVar265 * fStack_430 + fVar264 * fStack_440 + fVar160 * fStack_540);
                fVar201 = (fVar177 * 0.0 + 0.0) - fVar205;
                fVar199 = fVar258 * fVar258;
                fVar206 = fVar264 * fVar264;
                fVar245 = fVar201 * fVar201;
                auVar313._0_4_ = fVar199 + fVar256 * fVar256 + fVar206;
                auVar313._4_4_ = fVar199 + fVar199 + fVar245;
                auVar313._8_4_ = fVar199 + fVar206 + fVar206;
                auVar313._12_4_ = fVar199 + fVar245 + fVar245;
                fVar199 = (float)local_478._0_4_;
                if ((float)local_478._0_4_ <= fVar204) {
                  fVar199 = fVar204;
                }
                fVar206 = fVar158 * fVar158 + fVar125 * fVar125 + fVar159 * fVar159;
                auVar164 = ZEXT416((uint)fVar206);
                auVar84 = rsqrtss(ZEXT416((uint)fVar206),auVar164);
                fVar204 = auVar84._0_4_;
                fVar265 = fVar204 * 1.5 - fVar204 * fVar204 * fVar206 * 0.5 * fVar204;
                fVar288 = fVar125 * fVar265;
                fVar290 = fVar158 * fVar265;
                fVar293 = fVar159 * fVar265;
                fVar300 = fVar200 * fVar265;
                fVar274 = fVar263 * fVar159 + fVar257 * fVar158 + fVar246 * fVar125;
                auVar84 = rcpss(auVar164,auVar164);
                fVar204 = (2.0 - fVar206 * auVar84._0_4_) * auVar84._0_4_;
                fVar245 = fVar258 * fVar290;
                fVar160 = fVar264 * fVar293;
                fVar162 = fVar201 * fVar300;
                fVar275 = fVar245 + fVar256 * fVar288 + fVar160;
                fVar176 = fVar245 + fVar245 + fVar162;
                fVar160 = fVar245 + fVar160 + fVar160;
                fVar162 = fVar245 + fVar162 + fVar162;
                fVar278 = (SQRT(auVar313._0_4_) + 1.0) * ((float)local_478._0_4_ / SQRT(fVar206)) +
                          SQRT(auVar313._0_4_) * (float)local_478._0_4_ + fVar199;
                fVar245 = fVar300 * 0.0;
                fVar300 = fVar300 * -fVar200;
                fVar265 = fVar293 * -fVar159 + fVar290 * -fVar158 + fVar288 * -fVar125 +
                          fVar204 * (fVar206 * fVar263 - fVar274 * fVar159) * fVar265 * fVar264 +
                          fVar204 * (fVar206 * fVar257 - fVar274 * fVar158) * fVar265 * fVar258 +
                          fVar204 * (fVar206 * fVar246 - fVar274 * fVar125) * fVar265 * fVar256;
                fVar206 = fVar121 * fVar293 + fVar82 * fVar290 + fVar175 * fVar288;
                fVar246 = auVar313._0_4_ - fVar275 * fVar275;
                auVar115._0_8_ = CONCAT44(auVar313._4_4_ - fVar176 * fVar176,fVar246);
                auVar115._8_4_ = auVar313._8_4_ - fVar160 * fVar160;
                auVar115._12_4_ = auVar313._12_4_ - fVar162 * fVar162;
                fVar263 = -fVar200 * fVar201;
                local_5c8 = CONCAT44(fVar300,fVar265);
                fVar201 = fVar201 * 0.0;
                fVar204 = (fVar121 * fVar264 + fVar82 * fVar258 + fVar175 * fVar256) -
                          fVar275 * fVar206;
                auVar153._8_4_ = auVar115._8_4_;
                auVar153._0_8_ = auVar115._0_8_;
                auVar153._12_4_ = auVar115._12_4_;
                auVar84 = rsqrtss(auVar153,auVar115);
                fVar257 = auVar84._0_4_;
                auVar195._0_4_ = fVar257 * 1.5 - fVar257 * fVar257 * fVar246 * 0.5 * fVar257;
                auVar195._4_12_ = auVar84._4_12_;
                if (fVar246 < 0.0) {
                  fStack_4a4 = (float)local_478._4_4_;
                  fStack_4a0 = fStack_470;
                  fStack_49c = fStack_46c;
                  _local_4d8 = auVar195;
                  local_4c8 = fVar204;
                  fStack_4c4 = fVar201;
                  fStack_4c0 = fVar121 * fVar264;
                  fStack_4bc = fVar201;
                  local_4b8 = fVar206;
                  fStack_4b4 = fVar245;
                  fStack_4b0 = fVar121 * fVar293;
                  fStack_4ac = fVar245;
                  local_4a8 = fVar199;
                  _local_498 = auVar313;
                  local_488 = fVar125;
                  fStack_484 = fVar158;
                  fStack_480 = fVar159;
                  fStack_47c = fVar200;
                  fVar246 = sqrtf(fVar246);
                  auVar195 = _local_4d8;
                  auVar313 = _local_498;
                  fVar199 = local_4a8;
                  fVar257 = local_488;
                  fVar160 = fStack_484;
                  fVar162 = fStack_480;
                  fVar200 = fStack_47c;
                  fVar204 = local_4c8;
                  fVar201 = fStack_4c4;
                  fVar206 = local_4b8;
                  fVar245 = fStack_4b4;
                }
                else {
                  fVar246 = SQRT(fVar246);
                  fVar257 = fVar125;
                  fVar160 = fVar158;
                  fVar162 = fVar159;
                }
                fVar246 = fVar246 - fVar205;
                fVar205 = ((-fVar159 * fVar264 + -fVar158 * fVar258 + -fVar125 * fVar256) -
                          fVar275 * fVar265) * auVar195._0_4_ - fVar200;
                fVar204 = fVar204 * auVar195._0_4_;
                auVar196._0_4_ = fVar265 * fVar204 - fVar206 * fVar205;
                auVar229._8_4_ = -fVar263;
                auVar229._0_8_ = CONCAT44(fVar263,fVar205) ^ 0x8000000000000000;
                auVar229._12_4_ = fVar201;
                auVar228._8_8_ = auVar229._8_8_;
                auVar228._0_8_ = CONCAT44(fVar204,fVar205) ^ 0x80000000;
                auVar196._4_4_ = auVar196._0_4_;
                auVar196._8_4_ = auVar196._0_4_;
                auVar196._12_4_ = auVar196._0_4_;
                auVar84 = divps(auVar228,auVar196);
                auVar255._8_4_ = fVar300;
                auVar255._0_8_ = local_5c8;
                auVar255._12_4_ = -fVar245;
                auVar254._8_8_ = auVar255._8_8_;
                auVar254._0_8_ = CONCAT44(fVar206,fVar265) ^ 0x8000000000000000;
                auVar164 = divps(auVar254,auVar196);
                fVar177 = fVar177 - (fVar246 * auVar164._0_4_ + fVar275 * auVar84._0_4_);
                fVar124 = fVar124 - (fVar246 * auVar164._4_4_ + fVar275 * auVar84._4_4_);
                if ((ABS(fVar275) < fVar278) &&
                   (ABS(fVar246) < local_4e8 * 1.9073486e-06 + fVar199 + fVar278)) {
                  fVar177 = (float)local_3e8._0_4_ + fVar177;
                  if (fVar177 < fVar83) {
                    uVar63 = 0;
                    goto LAB_00b43767;
                  }
                  fVar199 = *(float *)(ray + k * 4 + 0x80);
                  if (fVar177 <= fVar199) {
                    uVar63 = 0;
                    if ((fVar124 < 0.0) || (1.0 < fVar124)) goto LAB_00b43767;
                    auVar84 = rsqrtss(auVar313,auVar313);
                    fVar201 = auVar84._0_4_;
                    pGVar18 = (context->scene->geometries).items[local_460].ptr;
                    pRVar69 = (RTCIntersectArguments *)context;
                    if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (uVar63 = CONCAT71((int7)((ulong)context->args >> 8),1),
                         pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar201 = fVar201 * 1.5 +
                                  fVar201 * fVar201 * auVar313._0_4_ * -0.5 * fVar201;
                        fVar256 = fVar256 * fVar201;
                        fVar258 = fVar258 * fVar201;
                        fVar264 = fVar264 * fVar201;
                        fVar201 = fVar200 * fVar256 + fVar257;
                        fVar204 = fVar200 * fVar258 + fVar160;
                        fVar200 = fVar200 * fVar264 + fVar162;
                        fVar205 = fVar258 * fVar257 - fVar160 * fVar256;
                        fVar206 = fVar264 * fVar160 - fVar162 * fVar258;
                        fVar245 = fVar256 * fVar162 - fVar257 * fVar264;
                        local_298 = fVar206 * fVar204 - fVar245 * fVar201;
                        local_2b8._4_4_ = fVar245 * fVar200 - fVar205 * fVar204;
                        local_2a8 = fVar205 * fVar201 - fVar206 * fVar200;
                        local_2b8._0_4_ = local_2b8._4_4_;
                        fStack_2b0 = (float)local_2b8._4_4_;
                        fStack_2ac = (float)local_2b8._4_4_;
                        fStack_2a4 = local_2a8;
                        fStack_2a0 = local_2a8;
                        fStack_29c = local_2a8;
                        fStack_294 = local_298;
                        fStack_290 = local_298;
                        fStack_28c = local_298;
                        local_288 = fVar124;
                        fStack_284 = fVar124;
                        fStack_280 = fVar124;
                        fStack_27c = fVar124;
                        local_278 = 0;
                        uStack_274 = 0;
                        uStack_270 = 0;
                        uStack_26c = 0;
                        local_268 = CONCAT44(uStack_3a4,local_3a8);
                        uStack_260 = CONCAT44(uStack_39c,uStack_3a0);
                        local_258 = CONCAT44(uStack_394,local_398);
                        uStack_250 = CONCAT44(uStack_38c,uStack_390);
                        local_248 = context->user->instID[0];
                        uStack_244 = local_248;
                        uStack_240 = local_248;
                        uStack_23c = local_248;
                        local_238 = context->user->instPrimID[0];
                        uStack_234 = local_238;
                        uStack_230 = local_238;
                        uStack_22c = local_238;
                        *(float *)(ray + k * 4 + 0x80) = fVar177;
                        local_5a8 = *local_468;
                        _local_538 = (int *)local_5a8;
                        uStack_530 = pGVar18->userPtr;
                        local_528 = context->user;
                        local_520 = ray;
                        local_518 = (RTCHitN *)local_2b8;
                        local_510 = 4;
                        p_Var65 = pGVar18->occlusionFilterN;
                        if (p_Var65 != (RTCFilterFunctionN)0x0) {
                          p_Var65 = (RTCFilterFunctionN)
                                    (*p_Var65)((RTCFilterFunctionNArguments *)local_538);
                        }
                        auVar154._0_4_ = -(uint)(local_5a8._0_4_ == 0);
                        auVar154._4_4_ = -(uint)(local_5a8._4_4_ == 0);
                        auVar154._8_4_ = -(uint)(local_5a8._8_4_ == 0);
                        auVar154._12_4_ = -(uint)(local_5a8._12_4_ == 0);
                        uVar77 = movmskps((int)p_Var65,auVar154);
                        pRVar64 = (RayK<4> *)(ulong)(uVar77 ^ 0xf);
                        if ((uVar77 ^ 0xf) == 0) {
                          auVar154 = auVar154 ^ _DAT_01f7ae20;
                        }
                        else {
                          pRVar69 = context->args;
                          if (((RTCIntersectArguments *)pRVar69->filter !=
                               (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar69->flags & 2) != 0 ||
                              (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                            (*(code *)pRVar69->filter)(local_538);
                          }
                          auVar116._0_4_ = -(uint)(local_5a8._0_4_ == 0);
                          auVar116._4_4_ = -(uint)(local_5a8._4_4_ == 0);
                          auVar116._8_4_ = -(uint)(local_5a8._8_4_ == 0);
                          auVar116._12_4_ = -(uint)(local_5a8._12_4_ == 0);
                          auVar154 = auVar116 ^ _DAT_01f7ae20;
                          *(undefined1 (*) [16])(local_520 + 0x80) =
                               ~auVar116 & _DAT_01f7aa00 |
                               *(undefined1 (*) [16])(local_520 + 0x80) & auVar116;
                          pRVar64 = local_520;
                        }
                        auVar155._0_4_ = auVar154._0_4_ << 0x1f;
                        auVar155._4_4_ = auVar154._4_4_ << 0x1f;
                        auVar155._8_4_ = auVar154._8_4_ << 0x1f;
                        auVar155._12_4_ = auVar154._12_4_ << 0x1f;
                        iVar60 = movmskps((int)pRVar64,auVar155);
                        uVar63 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar64 >> 0x20),iVar60) >> 8
                                                ),iVar60 != 0);
                        if (iVar60 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar199;
                        }
                      }
                      goto LAB_00b43767;
                    }
                  }
                  uVar63 = 0;
                  goto LAB_00b43767;
                }
                bVar76 = uVar73 < 4;
                uVar73 = uVar73 + 1;
              } while (uVar73 != 5);
              bVar76 = false;
              uVar63 = 5;
LAB_00b43767:
              uVar61 = SUB84(pRVar69,0);
              fVar300 = *(float *)(ray + k * 4 + 0x80);
              local_3d8._0_4_ = -(uint)(local_558 <= fVar300) & local_3d8._0_4_;
              local_3d8._4_4_ = -(uint)(fStack_554 <= fVar300) & local_3d8._4_4_;
              local_3d8._8_4_ = -(uint)(fStack_550 <= fVar300) & local_3d8._8_4_;
              local_3d8._12_4_ = -(uint)(fStack_54c <= fVar300) & local_3d8._12_4_;
              bVar71 = (bool)(bVar71 | bVar76 & (byte)uVar63);
              uVar68 = (undefined4)((ulong)uVar63 >> 0x20);
              iVar60 = movmskps((int)uVar63,local_3d8);
            } while (iVar60 != 0);
            iVar60 = 0;
            fVar231 = (float)local_228._0_4_;
            fVar232 = (float)local_228._4_4_;
            fVar233 = fStack_220;
            fVar244 = fStack_21c;
          }
          auVar197._0_4_ =
               local_598._0_4_ & local_408._0_4_ &
               -(uint)(fVar174 + (float)local_138._0_4_ <= fVar300);
          auVar197._4_4_ =
               local_598._4_4_ & local_408._4_4_ &
               -(uint)(fVar174 + (float)local_138._4_4_ <= fVar300);
          auVar197._8_4_ =
               (uint)fStack_590 & (uint)fStack_400 & -(uint)(fVar174 + fStack_130 <= fVar300);
          auVar197._12_4_ =
               (uint)fStack_58c & (uint)fStack_3fc & -(uint)(fVar174 + fStack_12c <= fVar300);
          auVar171._0_4_ = local_4f8._0_4_ & auVar149._0_4_ & -(uint)(fVar174 + fVar231 <= fVar300);
          auVar171._4_4_ = local_4f8._4_4_ & auVar149._4_4_ & -(uint)(fVar174 + fVar232 <= fVar300);
          auVar171._8_4_ = (uint)fStack_4f0 & auVar149._8_4_ & -(uint)(fVar174 + fVar233 <= fVar300)
          ;
          auVar171._12_4_ =
               (uint)fStack_4ec & auVar149._12_4_ & -(uint)(fVar174 + fVar244 <= fVar300);
          iVar60 = movmskps(iVar60,auVar171 | auVar197);
          if (iVar60 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar75 * 0x30) = auVar171 | auVar197;
            auStack_e8[uVar75 * 0xc] =
                 ~auVar197._0_4_ & (uint)fVar231 | local_138._0_4_ & auVar197._0_4_;
            auStack_e8[uVar75 * 0xc + 1] =
                 ~auVar197._4_4_ & (uint)fVar232 | local_138._4_4_ & auVar197._4_4_;
            auStack_e8[uVar75 * 0xc + 2] =
                 ~auVar197._8_4_ & (uint)fVar233 | (uint)fStack_130 & auVar197._8_4_;
            auStack_e8[uVar75 * 0xc + 3] =
                 ~auVar197._12_4_ & (uint)fVar244 | (uint)fStack_12c & auVar197._12_4_;
            (&uStack_d8)[uVar75 * 6] = CONCAT44(fStack_194,local_198);
            aiStack_d0[uVar75 * 0xc] = (int)fVar122 + 1;
            iVar74 = iVar74 + 1;
          }
        }
      }
    }
    if (iVar74 == 0) break;
    fVar122 = *(float *)(ray + k * 4 + 0x80);
    uVar78 = -iVar74;
    pauVar66 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar74 - 1) * 0x30);
    uVar77 = uVar78;
    while( true ) {
      auVar156._0_4_ = -(uint)(fVar174 + *(float *)pauVar66[1] <= fVar122) & *(uint *)*pauVar66;
      auVar156._4_4_ =
           -(uint)(fVar174 + *(float *)(pauVar66[1] + 4) <= fVar122) & *(uint *)(*pauVar66 + 4);
      auVar156._8_4_ =
           -(uint)(fVar174 + *(float *)(pauVar66[1] + 8) <= fVar122) & *(uint *)(*pauVar66 + 8);
      auVar156._12_4_ =
           -(uint)(fVar174 + *(float *)(pauVar66[1] + 0xc) <= fVar122) & *(uint *)(*pauVar66 + 0xc);
      _local_2b8 = auVar156;
      iVar60 = movmskps(uVar77,auVar156);
      if (iVar60 != 0) break;
      pauVar66 = pauVar66 + -3;
      uVar78 = uVar78 + 1;
      uVar77 = 0;
      if (uVar78 == 0) {
        uVar61 = 0;
        goto LAB_00b43d04;
      }
    }
    auVar172._0_4_ = (uint)*(float *)pauVar66[1] & auVar156._0_4_;
    auVar172._4_4_ = (uint)*(float *)(pauVar66[1] + 4) & auVar156._4_4_;
    auVar172._8_4_ = (uint)*(float *)(pauVar66[1] + 8) & auVar156._8_4_;
    auVar172._12_4_ = (uint)*(float *)(pauVar66[1] + 0xc) & auVar156._12_4_;
    auVar198._0_8_ = CONCAT44(~auVar156._4_4_,~auVar156._0_4_) & 0x7f8000007f800000;
    auVar198._8_4_ = ~auVar156._8_4_ & 0x7f800000;
    auVar198._12_4_ = ~auVar156._12_4_ & 0x7f800000;
    auVar198 = auVar198 | auVar172;
    auVar173._4_4_ = auVar198._0_4_;
    auVar173._0_4_ = auVar198._4_4_;
    auVar173._8_4_ = auVar198._12_4_;
    auVar173._12_4_ = auVar198._8_4_;
    auVar84 = minps(auVar173,auVar198);
    auVar117._0_8_ = auVar84._8_8_;
    auVar117._8_4_ = auVar84._0_4_;
    auVar117._12_4_ = auVar84._4_4_;
    auVar84 = minps(auVar117,auVar84);
    auVar118._0_8_ =
         CONCAT44(-(uint)(auVar84._4_4_ == auVar198._4_4_) & auVar156._4_4_,
                  -(uint)(auVar84._0_4_ == auVar198._0_4_) & auVar156._0_4_);
    auVar118._8_4_ = -(uint)(auVar84._8_4_ == auVar198._8_4_) & auVar156._8_4_;
    auVar118._12_4_ = -(uint)(auVar84._12_4_ == auVar198._12_4_) & auVar156._12_4_;
    iVar60 = movmskps(iVar60,auVar118);
    if (iVar60 != 0) {
      auVar156._8_4_ = auVar118._8_4_;
      auVar156._0_8_ = auVar118._0_8_;
      auVar156._12_4_ = auVar118._12_4_;
    }
    uVar63 = *(undefined8 *)pauVar66[2];
    fVar122 = *(float *)(pauVar66[2] + 8);
    uVar77 = movmskps(iVar60,auVar156);
    pRVar69 = (RTCIntersectArguments *)0x0;
    if (uVar77 != 0) {
      for (; (uVar77 >> (long)pRVar69 & 1) == 0;
          pRVar69 = (RTCIntersectArguments *)((long)&pRVar69->flags + 1)) {
      }
    }
    *(undefined4 *)(local_2b8 + (long)pRVar69 * 4) = 0;
    *pauVar66 = _local_2b8;
    iVar60 = movmskps((int)pauVar66,_local_2b8);
    lVar67 = CONCAT44((int)((ulong)pauVar66 >> 0x20),iVar60);
    uVar77 = ~uVar78;
    if (iVar60 != 0) {
      uVar77 = -uVar78;
    }
    uVar75 = (ulong)uVar77;
    fVar124 = (float)uVar63;
    fVar177 = (float)((ulong)uVar63 >> 0x20) - fVar124;
    _local_538 = (int *)CONCAT44(fVar177 * 0.33333334 + fVar124,fVar177 * 0.0 + fVar124);
    uStack_530 = (void *)CONCAT44(fVar177 * 1.0 + fVar124,fVar177 * 0.6666667 + fVar124);
    local_198 = *(float *)(local_538 + (long)pRVar69 * 4);
    fStack_194 = *(float *)(local_538 + (long)pRVar69 * 4 + 4);
  } while( true );
LAB_00b43d04:
  if (bVar71 != false) {
    return bVar71;
  }
  fVar175 = *(float *)(ray + k * 4 + 0x80);
  auVar157._4_4_ = -(uint)(fStack_204 <= fVar175);
  auVar157._0_4_ = -(uint)(local_208 <= fVar175);
  auVar157._8_4_ = -(uint)(fStack_200 <= fVar175);
  auVar157._12_4_ = -(uint)(fStack_1fc <= fVar175);
  uVar77 = movmskps(uVar61,auVar157);
  uVar77 = (uint)local_3b0 - 1 & (uint)local_3b0 & uVar77;
  if (uVar77 == 0) {
    return false;
  }
  goto LAB_00b4124d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }